

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  ulong uVar76;
  Geometry *pGVar77;
  undefined8 unaff_RBX;
  ulong uVar78;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar85;
  undefined1 auVar90 [16];
  Primitive *pPVar79;
  long lVar80;
  long lVar81;
  byte bVar82;
  ulong uVar83;
  float fVar84;
  float fVar134;
  float fVar135;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar88 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar89 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar91 [16];
  float fVar137;
  float fVar140;
  float fVar141;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar142;
  undefined4 uVar143;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined8 uVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar172;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  RayQueryContext *local_548;
  RayHit *local_540;
  Precalculations *local_538;
  Primitive *local_530;
  Primitive *local_528;
  long local_520;
  RTCFilterFunctionNArguments local_518;
  uint local_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [8];
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined4 local_488;
  float local_484;
  undefined4 local_480;
  uint local_47c;
  undefined4 local_478;
  uint local_474;
  uint local_470;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar72 = (ulong)(byte)prim[1];
  pPVar79 = prim + uVar72 * 0x19 + 0x16;
  fVar161 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar156 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar160 = fVar161 * auVar156._0_4_;
  fVar142 = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar86);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar87);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar107 = vpmovsxbd_avx2(auVar90);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar106 = vpmovsxbd_avx2(auVar6);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar72 * 0xc + 6);
  auVar98 = vpmovsxbd_avx2(auVar7);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar72 * 0xd + 6);
  auVar96 = vpmovsxbd_avx2(auVar8);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar72 * 0x12 + 6);
  auVar99 = vpmovsxbd_avx2(auVar9);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar72 * 0x13 + 6);
  auVar105 = vpmovsxbd_avx2(auVar10);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar72 * 0x14 + 6);
  auVar100 = vpmovsxbd_avx2(auVar11);
  auVar102 = vcvtdq2ps_avx(auVar100);
  auVar204._4_4_ = fVar142;
  auVar204._0_4_ = fVar142;
  auVar204._8_4_ = fVar142;
  auVar204._12_4_ = fVar142;
  auVar204._16_4_ = fVar142;
  auVar204._20_4_ = fVar142;
  auVar204._24_4_ = fVar142;
  auVar204._28_4_ = fVar142;
  auVar206._8_4_ = 1;
  auVar206._0_8_ = 0x100000001;
  auVar206._12_4_ = 1;
  auVar206._16_4_ = 1;
  auVar206._20_4_ = 1;
  auVar206._24_4_ = 1;
  auVar206._28_4_ = 1;
  auVar94 = ZEXT1632(CONCAT412(fVar161 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar161 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar161 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar142))));
  auVar101 = vpermps_avx2(auVar206,auVar94);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar210 = ZEXT3264(auVar92);
  auVar93 = vpermps_avx512vl(auVar92,auVar94);
  fVar142 = auVar93._0_4_;
  auVar211._0_4_ = fVar142 * auVar107._0_4_;
  fVar152 = auVar93._4_4_;
  auVar211._4_4_ = fVar152 * auVar107._4_4_;
  fVar153 = auVar93._8_4_;
  auVar211._8_4_ = fVar153 * auVar107._8_4_;
  fVar154 = auVar93._12_4_;
  auVar211._12_4_ = fVar154 * auVar107._12_4_;
  fVar172 = auVar93._16_4_;
  auVar211._16_4_ = fVar172 * auVar107._16_4_;
  fVar84 = auVar93._20_4_;
  auVar211._20_4_ = fVar84 * auVar107._20_4_;
  fVar85 = auVar93._24_4_;
  auVar211._28_36_ = in_ZMM4._28_36_;
  auVar211._24_4_ = fVar85 * auVar107._24_4_;
  auVar94._4_4_ = auVar96._4_4_ * fVar152;
  auVar94._0_4_ = auVar96._0_4_ * fVar142;
  auVar94._8_4_ = auVar96._8_4_ * fVar153;
  auVar94._12_4_ = auVar96._12_4_ * fVar154;
  auVar94._16_4_ = auVar96._16_4_ * fVar172;
  auVar94._20_4_ = auVar96._20_4_ * fVar84;
  auVar94._24_4_ = auVar96._24_4_ * fVar85;
  auVar94._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar102._4_4_ * fVar152;
  auVar100._0_4_ = auVar102._0_4_ * fVar142;
  auVar100._8_4_ = auVar102._8_4_ * fVar153;
  auVar100._12_4_ = auVar102._12_4_ * fVar154;
  auVar100._16_4_ = auVar102._16_4_ * fVar172;
  auVar100._20_4_ = auVar102._20_4_ * fVar84;
  auVar100._24_4_ = auVar102._24_4_ * fVar85;
  auVar100._28_4_ = auVar93._28_4_;
  auVar86 = vfmadd231ps_fma(auVar211._0_32_,auVar101,auVar95);
  auVar87 = vfmadd231ps_fma(auVar94,auVar101,auVar98);
  auVar90 = vfmadd231ps_fma(auVar100,auVar105,auVar101);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar204,auVar97);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar204,auVar106);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar99,auVar204);
  auVar205._4_4_ = fVar160;
  auVar205._0_4_ = fVar160;
  auVar205._8_4_ = fVar160;
  auVar205._12_4_ = fVar160;
  auVar205._16_4_ = fVar160;
  auVar205._20_4_ = fVar160;
  auVar205._24_4_ = fVar160;
  auVar205._28_4_ = fVar160;
  auVar101 = ZEXT1632(CONCAT412(fVar161 * auVar156._12_4_,
                                CONCAT48(fVar161 * auVar156._8_4_,
                                         CONCAT44(fVar161 * auVar156._4_4_,fVar160))));
  auVar100 = vpermps_avx2(auVar206,auVar101);
  auVar94 = vpermps_avx512vl(auVar92,auVar101);
  fVar161 = auVar94._0_4_;
  fVar142 = auVar94._4_4_;
  auVar101._4_4_ = fVar142 * auVar107._4_4_;
  auVar101._0_4_ = fVar161 * auVar107._0_4_;
  fVar152 = auVar94._8_4_;
  auVar101._8_4_ = fVar152 * auVar107._8_4_;
  fVar153 = auVar94._12_4_;
  auVar101._12_4_ = fVar153 * auVar107._12_4_;
  fVar154 = auVar94._16_4_;
  auVar101._16_4_ = fVar154 * auVar107._16_4_;
  fVar172 = auVar94._20_4_;
  auVar101._20_4_ = fVar172 * auVar107._20_4_;
  fVar84 = auVar94._24_4_;
  auVar101._24_4_ = fVar84 * auVar107._24_4_;
  auVar101._28_4_ = 1;
  auVar92._4_4_ = auVar96._4_4_ * fVar142;
  auVar92._0_4_ = auVar96._0_4_ * fVar161;
  auVar92._8_4_ = auVar96._8_4_ * fVar152;
  auVar92._12_4_ = auVar96._12_4_ * fVar153;
  auVar92._16_4_ = auVar96._16_4_ * fVar154;
  auVar92._20_4_ = auVar96._20_4_ * fVar172;
  auVar92._24_4_ = auVar96._24_4_ * fVar84;
  auVar92._28_4_ = auVar107._28_4_;
  auVar96._4_4_ = auVar102._4_4_ * fVar142;
  auVar96._0_4_ = auVar102._0_4_ * fVar161;
  auVar96._8_4_ = auVar102._8_4_ * fVar152;
  auVar96._12_4_ = auVar102._12_4_ * fVar153;
  auVar96._16_4_ = auVar102._16_4_ * fVar154;
  auVar96._20_4_ = auVar102._20_4_ * fVar172;
  auVar96._24_4_ = auVar102._24_4_ * fVar84;
  auVar96._28_4_ = auVar94._28_4_;
  auVar6 = vfmadd231ps_fma(auVar101,auVar100,auVar95);
  auVar7 = vfmadd231ps_fma(auVar92,auVar100,auVar98);
  auVar8 = vfmadd231ps_fma(auVar96,auVar100,auVar105);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar205,auVar97);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar205,auVar106);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar205,auVar99);
  auVar193._8_4_ = 0x7fffffff;
  auVar193._0_8_ = 0x7fffffff7fffffff;
  auVar193._12_4_ = 0x7fffffff;
  auVar193._16_4_ = 0x7fffffff;
  auVar193._20_4_ = 0x7fffffff;
  auVar193._24_4_ = 0x7fffffff;
  auVar193._28_4_ = 0x7fffffff;
  auVar97 = vandps_avx(ZEXT1632(auVar86),auVar193);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar191._16_4_ = 0x219392ef;
  auVar191._20_4_ = 0x219392ef;
  auVar191._24_4_ = 0x219392ef;
  auVar191._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar97,auVar191,1);
  bVar15 = (bool)((byte)uVar78 & 1);
  auVar93._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._0_4_;
  bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._4_4_;
  bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._8_4_;
  bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar87),auVar193);
  uVar78 = vcmpps_avx512vl(auVar97,auVar191,1);
  bVar15 = (bool)((byte)uVar78 & 1);
  auVar103._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._0_4_;
  bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._4_4_;
  bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._8_4_;
  bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar90),auVar193);
  uVar78 = vcmpps_avx512vl(auVar97,auVar191,1);
  bVar15 = (bool)((byte)uVar78 & 1);
  auVar97._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar90._0_4_;
  bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar90._4_4_;
  bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar90._8_4_;
  bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar90._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar93);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = 0x3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar192._16_4_ = 0x3f800000;
  auVar192._20_4_ = 0x3f800000;
  auVar192._24_4_ = 0x3f800000;
  auVar192._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar93,auVar95,auVar192);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar103);
  auVar87 = vfnmadd213ps_fma(auVar103,auVar95,auVar192);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar97);
  auVar90 = vfnmadd213ps_fma(auVar97,auVar95,auVar192);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar95,auVar95);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar6));
  auVar99._4_4_ = auVar86._4_4_ * auVar97._4_4_;
  auVar99._0_4_ = auVar86._0_4_ * auVar97._0_4_;
  auVar99._8_4_ = auVar86._8_4_ * auVar97._8_4_;
  auVar99._12_4_ = auVar86._12_4_ * auVar97._12_4_;
  auVar99._16_4_ = auVar97._16_4_ * 0.0;
  auVar99._20_4_ = auVar97._20_4_ * 0.0;
  auVar99._24_4_ = auVar97._24_4_ * 0.0;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar6));
  auVar184._0_4_ = auVar86._0_4_ * auVar97._0_4_;
  auVar184._4_4_ = auVar86._4_4_ * auVar97._4_4_;
  auVar184._8_4_ = auVar86._8_4_ * auVar97._8_4_;
  auVar184._12_4_ = auVar86._12_4_ * auVar97._12_4_;
  auVar184._16_4_ = auVar97._16_4_ * 0.0;
  auVar184._20_4_ = auVar97._20_4_ * 0.0;
  auVar184._24_4_ = auVar97._24_4_ * 0.0;
  auVar184._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xe + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar7));
  auVar96 = vpbroadcastd_avx512vl();
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar105._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar105._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar105._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar105._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar105._16_4_ = auVar97._16_4_ * 0.0;
  auVar105._20_4_ = auVar97._20_4_ * 0.0;
  auVar105._24_4_ = auVar97._24_4_ * 0.0;
  auVar105._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar95);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar7));
  auVar108._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar108._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar108._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar108._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar108._16_4_ = auVar97._16_4_ * 0.0;
  auVar108._20_4_ = auVar97._20_4_ * 0.0;
  auVar108._24_4_ = auVar97._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x15 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar8));
  auVar102._4_4_ = auVar97._4_4_ * auVar90._4_4_;
  auVar102._0_4_ = auVar97._0_4_ * auVar90._0_4_;
  auVar102._8_4_ = auVar97._8_4_ * auVar90._8_4_;
  auVar102._12_4_ = auVar97._12_4_ * auVar90._12_4_;
  auVar102._16_4_ = auVar97._16_4_ * 0.0;
  auVar102._20_4_ = auVar97._20_4_ * 0.0;
  auVar102._24_4_ = auVar97._24_4_ * 0.0;
  auVar102._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar8));
  auVar104._0_4_ = auVar90._0_4_ * auVar97._0_4_;
  auVar104._4_4_ = auVar90._4_4_ * auVar97._4_4_;
  auVar104._8_4_ = auVar90._8_4_ * auVar97._8_4_;
  auVar104._12_4_ = auVar90._12_4_ * auVar97._12_4_;
  auVar104._16_4_ = auVar97._16_4_ * 0.0;
  auVar104._20_4_ = auVar97._20_4_ * 0.0;
  auVar104._24_4_ = auVar97._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar99,auVar184);
  auVar95 = vpminsd_avx2(auVar105,auVar108);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95 = vpminsd_avx2(auVar102,auVar104);
  uVar143 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar107._4_4_ = uVar143;
  auVar107._0_4_ = uVar143;
  auVar107._8_4_ = uVar143;
  auVar107._12_4_ = uVar143;
  auVar107._16_4_ = uVar143;
  auVar107._20_4_ = uVar143;
  auVar107._24_4_ = uVar143;
  auVar107._28_4_ = uVar143;
  auVar95 = vmaxps_avx512vl(auVar95,auVar107);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar97,auVar95);
  auVar97 = vpmaxsd_avx2(auVar99,auVar184);
  auVar95 = vpmaxsd_avx2(auVar105,auVar108);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar95 = vpmaxsd_avx2(auVar102,auVar104);
  fVar161 = (ray->super_RayK<1>).tfar;
  auVar106._4_4_ = fVar161;
  auVar106._0_4_ = fVar161;
  auVar106._8_4_ = fVar161;
  auVar106._12_4_ = fVar161;
  auVar106._16_4_ = fVar161;
  auVar106._20_4_ = fVar161;
  auVar106._24_4_ = fVar161;
  auVar106._28_4_ = fVar161;
  auVar95 = vminps_avx512vl(auVar95,auVar106);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar98);
  uVar155 = vcmpps_avx512vl(local_80,auVar97,2);
  uVar21 = vpcmpgtd_avx512vl(auVar96,_DAT_01fb4ba0);
  uVar78 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),(uint)(byte)((byte)uVar155 & (byte)uVar21));
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar211 = ZEXT1664(auVar86);
  auVar212 = ZEXT464(0x35000000);
  local_540 = ray;
  local_548 = context;
  local_528 = prim;
  local_530 = pPVar79;
  local_538 = pre;
  do {
    if (uVar78 == 0) {
      return;
    }
    lVar80 = 0;
    for (uVar72 = uVar78; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      lVar80 = lVar80 + 1;
    }
    uVar78 = uVar78 - 1 & uVar78;
    uVar12 = *(uint *)(prim + lVar80 * 4 + 6);
    uVar72 = (ulong)(uint)((int)lVar80 << 6);
    uVar73 = *(uint *)(prim + 2);
    local_550 = (ulong)uVar73;
    pGVar77 = (context->scene->geometries).items[uVar73].ptr;
    local_4e0 = *(undefined1 (*) [16])(pPVar79 + uVar72);
    if (uVar78 != 0) {
      uVar76 = uVar78 - 1 & uVar78;
      for (uVar83 = uVar78; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
      if (uVar76 != 0) {
        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_4b0 = *(undefined1 (*) [16])(pPVar79 + uVar72 + 0x10);
    local_4c0 = *(undefined1 (*) [16])(pPVar79 + uVar72 + 0x20);
    _local_4d0 = *(undefined1 (*) [16])(pPVar79 + uVar72 + 0x30);
    iVar13 = (int)pGVar77[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar3 = (ray->super_RayK<1>).org.field_0;
    auVar87 = vsubps_avx(local_4e0,(undefined1  [16])aVar3);
    uVar143 = auVar87._0_4_;
    auVar156._4_4_ = uVar143;
    auVar156._0_4_ = uVar143;
    auVar156._8_4_ = uVar143;
    auVar156._12_4_ = uVar143;
    auVar86 = vshufps_avx(auVar87,auVar87,0x55);
    aVar4 = (pre->ray_space).vx.field_0;
    aVar5 = (pre->ray_space).vy.field_0;
    fVar161 = (pre->ray_space).vz.field_0.m128[0];
    fVar142 = (pre->ray_space).vz.field_0.m128[1];
    fVar152 = (pre->ray_space).vz.field_0.m128[2];
    fVar153 = (pre->ray_space).vz.field_0.m128[3];
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar196._0_4_ = auVar87._0_4_ * fVar161;
    auVar196._4_4_ = auVar87._4_4_ * fVar142;
    auVar196._8_4_ = auVar87._8_4_ * fVar152;
    auVar196._12_4_ = auVar87._12_4_ * fVar153;
    auVar86 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar5,auVar86);
    auVar90 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar156);
    auVar87 = vsubps_avx(local_4b0,(undefined1  [16])aVar3);
    uVar143 = auVar87._0_4_;
    auVar157._4_4_ = uVar143;
    auVar157._0_4_ = uVar143;
    auVar157._8_4_ = uVar143;
    auVar157._12_4_ = uVar143;
    auVar86 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar89._0_4_ = auVar87._0_4_ * fVar161;
    auVar89._4_4_ = auVar87._4_4_ * fVar142;
    auVar89._8_4_ = auVar87._8_4_ * fVar152;
    auVar89._12_4_ = auVar87._12_4_ * fVar153;
    auVar86 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar86);
    auVar6 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar157);
    auVar87 = vsubps_avx512vl(local_4c0,(undefined1  [16])aVar3);
    uVar143 = auVar87._0_4_;
    auVar158._4_4_ = uVar143;
    auVar158._0_4_ = uVar143;
    auVar158._8_4_ = uVar143;
    auVar158._12_4_ = uVar143;
    auVar86 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar200._0_4_ = auVar87._0_4_ * fVar161;
    auVar200._4_4_ = auVar87._4_4_ * fVar142;
    auVar200._8_4_ = auVar87._8_4_ * fVar152;
    auVar200._12_4_ = auVar87._12_4_ * fVar153;
    auVar86 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar86);
    auVar7 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar158);
    local_3e0 = ZEXT1632((undefined1  [16])aVar3);
    auVar87 = vsubps_avx512vl(_local_4d0,(undefined1  [16])aVar3);
    uVar143 = auVar87._0_4_;
    auVar88._4_4_ = uVar143;
    auVar88._0_4_ = uVar143;
    auVar88._8_4_ = uVar143;
    auVar88._12_4_ = uVar143;
    auVar86 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar201._0_4_ = auVar87._0_4_ * fVar161;
    auVar201._4_4_ = auVar87._4_4_ * fVar142;
    auVar201._8_4_ = auVar87._8_4_ * fVar152;
    auVar201._12_4_ = auVar87._12_4_ * fVar153;
    auVar86 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar5,auVar86);
    auVar8 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar88);
    local_520 = (long)iVar13;
    lVar80 = local_520 * 0x44;
    auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar80);
    uVar143 = auVar90._0_4_;
    local_2e0._4_4_ = uVar143;
    local_2e0._0_4_ = uVar143;
    local_2e0._8_4_ = uVar143;
    local_2e0._12_4_ = uVar143;
    local_2e0._16_4_ = uVar143;
    local_2e0._20_4_ = uVar143;
    local_2e0._24_4_ = uVar143;
    local_2e0._28_4_ = uVar143;
    auVar144._8_4_ = 1;
    auVar144._0_8_ = 0x100000001;
    auVar144._12_4_ = 1;
    auVar144._16_4_ = 1;
    auVar144._20_4_ = 1;
    auVar144._24_4_ = 1;
    auVar144._28_4_ = 1;
    local_300 = vpermps_avx2(auVar144,ZEXT1632(auVar90));
    auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 + 0x484);
    uVar143 = auVar6._0_4_;
    auVar91._4_4_ = uVar143;
    auVar91._0_4_ = uVar143;
    auVar91._8_4_ = uVar143;
    auVar91._12_4_ = uVar143;
    local_320._16_4_ = uVar143;
    local_320._0_16_ = auVar91;
    local_320._20_4_ = uVar143;
    local_320._24_4_ = uVar143;
    local_320._28_4_ = uVar143;
    auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 + 0x908);
    local_340 = vpermps_avx512vl(auVar144,ZEXT1632(auVar6));
    local_360 = vbroadcastss_avx512vl(auVar7);
    local_380 = vpermps_avx512vl(auVar144,ZEXT1632(auVar7));
    auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 + 0xd8c);
    fVar161 = auVar8._0_4_;
    local_3a0._4_4_ = fVar161;
    local_3a0._0_4_ = fVar161;
    fStack_398 = fVar161;
    fStack_394 = fVar161;
    fStack_390 = fVar161;
    fStack_38c = fVar161;
    fStack_388 = fVar161;
    register0x0000139c = fVar161;
    _local_3c0 = vpermps_avx512vl(auVar144,ZEXT1632(auVar8));
    auVar98 = vmulps_avx512vl(_local_3a0,auVar106);
    auVar96 = vmulps_avx512vl(_local_3c0,auVar106);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_360);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,local_380);
    auVar86 = vfmadd231ps_fma(auVar98,auVar95,local_320);
    auVar99 = vfmadd231ps_avx512vl(auVar96,auVar95,local_340);
    auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar97,local_2e0);
    auVar190 = ZEXT3264(auVar100);
    auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar80);
    auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 + 0x484);
    auVar101 = vfmadd231ps_avx512vl(auVar99,auVar97,local_300);
    auVar189 = ZEXT3264(auVar101);
    auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 + 0x908);
    auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 + 0xd8c);
    auVar102 = vmulps_avx512vl(_local_3a0,auVar105);
    auVar94 = vmulps_avx512vl(_local_3c0,auVar105);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,local_360);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_380);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,local_320);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,local_340);
    auVar9 = vfmadd231ps_fma(auVar102,auVar98,local_2e0);
    auVar194 = ZEXT1664(auVar9);
    auVar10 = vfmadd231ps_fma(auVar94,auVar98,local_300);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar9),auVar100);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar10),auVar101);
    auVar102 = vmulps_avx512vl(auVar101,auVar94);
    auVar93 = vmulps_avx512vl(auVar100,auVar92);
    auVar102 = vsubps_avx512vl(auVar102,auVar93);
    auVar86 = vshufps_avx(local_4e0,local_4e0,0xff);
    uVar155 = auVar86._0_8_;
    local_a0._8_8_ = uVar155;
    local_a0._0_8_ = uVar155;
    local_a0._16_8_ = uVar155;
    local_a0._24_8_ = uVar155;
    auVar86 = vshufps_avx(local_4b0,local_4b0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar86);
    auVar86 = vshufps_avx512vl(local_4c0,local_4c0,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar86);
    auVar86 = vshufps_avx512vl(_local_4d0,_local_4d0,0xff);
    uVar155 = auVar86._0_8_;
    local_100._8_8_ = uVar155;
    local_100._0_8_ = uVar155;
    local_100._16_8_ = uVar155;
    local_100._24_8_ = uVar155;
    auVar93 = vmulps_avx512vl(local_100,auVar106);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_e0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,local_c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,local_a0);
    auVar103 = vmulps_avx512vl(local_100,auVar105);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,local_e0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,local_c0);
    auVar11 = vfmadd231ps_fma(auVar103,auVar98,local_a0);
    auVar103 = vmulps_avx512vl(auVar92,auVar92);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar94);
    auVar104 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar11));
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    uVar155 = vcmpps_avx512vl(auVar102,auVar103,2);
    auVar86 = vblendps_avx(auVar90,local_4e0,8);
    auVar196 = auVar211._0_16_;
    auVar87 = vandps_avx512vl(auVar86,auVar196);
    auVar158 = local_4b0;
    auVar86 = vblendps_avx(auVar6,local_4b0,8);
    auVar86 = vandps_avx512vl(auVar86,auVar196);
    auVar87 = vmaxps_avx(auVar87,auVar86);
    auVar157 = local_4c0;
    auVar86 = vblendps_avx(auVar7,local_4c0,8);
    auVar88 = vandps_avx512vl(auVar86,auVar196);
    auVar156 = _local_4d0;
    auVar86 = vblendps_avx(auVar8,_local_4d0,8);
    auVar86 = vandps_avx512vl(auVar86,auVar196);
    auVar86 = vmaxps_avx(auVar88,auVar86);
    auVar86 = vmaxps_avx(auVar87,auVar86);
    auVar87 = vmovshdup_avx(auVar86);
    auVar87 = vmaxss_avx(auVar87,auVar86);
    auVar86 = vshufpd_avx(auVar86,auVar86,1);
    auVar86 = vmaxss_avx(auVar86,auVar87);
    local_4a0 = vcvtsi2ss_avx512f(_local_4d0,iVar13);
    auVar203._0_4_ = local_4a0._0_4_;
    auVar203._4_4_ = auVar203._0_4_;
    auVar203._8_4_ = auVar203._0_4_;
    auVar203._12_4_ = auVar203._0_4_;
    auVar203._16_4_ = auVar203._0_4_;
    auVar203._20_4_ = auVar203._0_4_;
    auVar203._24_4_ = auVar203._0_4_;
    auVar203._28_4_ = auVar203._0_4_;
    uVar21 = vcmpps_avx512vl(auVar203,_DAT_01f7b060,0xe);
    bVar82 = (byte)uVar155 & (byte)uVar21;
    auVar86 = vmulss_avx512f(auVar86,auVar212._0_16_);
    local_420._0_16_ = auVar86;
    auVar102 = local_420;
    auVar104 = auVar210._0_32_;
    auVar103 = vpermps_avx512vl(auVar104,ZEXT1632(auVar90));
    local_160 = vpermps_avx512vl(auVar104,ZEXT1632(auVar6));
    local_180 = vpermps_avx512vl(auVar104,ZEXT1632(auVar7));
    local_1a0 = vpermps_avx512vl(auVar104,ZEXT1632(auVar8));
    _local_4d0 = auVar156;
    local_4c0 = auVar157;
    local_4b0 = auVar158;
    local_420 = auVar102;
    if (bVar82 != 0) {
      auVar105 = vmulps_avx512vl(local_1a0,auVar105);
      auVar99 = vfmadd213ps_avx512vl(auVar99,local_180,auVar105);
      auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar99);
      auVar96 = vfmadd213ps_avx512vl(auVar98,auVar103,auVar96);
      auVar106 = vmulps_avx512vl(local_1a0,auVar106);
      auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar106);
      auVar99 = vfmadd213ps_avx512vl(auVar95,local_160,auVar107);
      auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 + 0x1694);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 + 0x1f9c);
      auVar99 = vfmadd213ps_avx512vl(auVar97,auVar103,auVar99);
      auVar198._0_4_ = fVar161 * auVar98._0_4_;
      auVar198._4_4_ = fVar161 * auVar98._4_4_;
      auVar198._8_4_ = fVar161 * auVar98._8_4_;
      auVar198._12_4_ = fVar161 * auVar98._12_4_;
      auVar198._16_4_ = fVar161 * auVar98._16_4_;
      auVar198._20_4_ = fVar161 * auVar98._20_4_;
      auVar198._24_4_ = fVar161 * auVar98._24_4_;
      auVar198._28_4_ = 0;
      auVar97 = vmulps_avx512vl(_local_3c0,auVar98);
      auVar98 = vmulps_avx512vl(local_1a0,auVar98);
      auVar105 = vfmadd231ps_avx512vl(auVar198,auVar106,local_360);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,local_380);
      auVar106 = vfmadd231ps_avx512vl(auVar98,local_180,auVar106);
      auVar98 = vfmadd231ps_avx512vl(auVar105,auVar107,local_320);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar107,local_340);
      auVar105 = vfmadd231ps_avx512vl(auVar106,local_160,auVar107);
      auVar87 = vfmadd231ps_fma(auVar98,auVar95,local_2e0);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar95,local_300);
      auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 + 0x1b18);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 + 0x1f9c);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar95);
      auVar37._4_4_ = fVar161 * auVar106._4_4_;
      auVar37._0_4_ = fVar161 * auVar106._0_4_;
      auVar37._8_4_ = fVar161 * auVar106._8_4_;
      auVar37._12_4_ = fVar161 * auVar106._12_4_;
      auVar37._16_4_ = fVar161 * auVar106._16_4_;
      auVar37._20_4_ = fVar161 * auVar106._20_4_;
      auVar37._24_4_ = fVar161 * auVar106._24_4_;
      auVar37._28_4_ = auVar95._28_4_;
      auVar95 = vmulps_avx512vl(_local_3c0,auVar106);
      auVar106 = vmulps_avx512vl(local_1a0,auVar106);
      auVar102 = vfmadd231ps_avx512vl(auVar37,auVar107,local_360);
      auVar108 = vfmadd231ps_avx512vl(auVar95,auVar107,local_380);
      auVar209 = ZEXT3264(auVar103);
      auVar107 = vfmadd231ps_avx512vl(auVar106,local_180,auVar107);
      auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 + 0x1694);
      auVar106 = vfmadd231ps_avx512vl(auVar102,auVar95,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar108,auVar95,local_340);
      auVar95 = vfmadd231ps_avx512vl(auVar107,local_160,auVar95);
      auVar212 = ZEXT1664(auVar212._0_16_);
      auVar210 = ZEXT3264(auVar104);
      auVar211 = ZEXT1664(auVar196);
      auVar90 = vfmadd231ps_fma(auVar106,auVar97,local_2e0);
      auVar107 = vfmadd231ps_avx512vl(auVar102,auVar97,local_300);
      auVar106 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar97);
      auVar207._8_4_ = 0x7fffffff;
      auVar207._0_8_ = 0x7fffffff7fffffff;
      auVar207._12_4_ = 0x7fffffff;
      auVar207._16_4_ = 0x7fffffff;
      auVar207._20_4_ = 0x7fffffff;
      auVar207._24_4_ = 0x7fffffff;
      auVar207._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(ZEXT1632(auVar87),auVar207);
      auVar95 = vandps_avx(auVar98,auVar207);
      auVar95 = vmaxps_avx(auVar97,auVar95);
      auVar97 = vandps_avx(auVar105,auVar207);
      auVar97 = vmaxps_avx(auVar95,auVar97);
      local_420._0_4_ = auVar86._0_4_;
      auVar202._4_4_ = local_420._0_4_;
      auVar202._0_4_ = local_420._0_4_;
      auVar202._8_4_ = local_420._0_4_;
      auVar202._12_4_ = local_420._0_4_;
      auVar202._16_4_ = local_420._0_4_;
      auVar202._20_4_ = local_420._0_4_;
      auVar202._24_4_ = local_420._0_4_;
      auVar202._28_4_ = local_420._0_4_;
      uVar72 = vcmpps_avx512vl(auVar97,auVar202,1);
      bVar15 = (bool)((byte)uVar72 & 1);
      auVar109._0_4_ = (float)((uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar87._0_4_);
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar87._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar87._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar87._12_4_);
      fVar161 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar94._16_4_);
      auVar109._16_4_ = fVar161;
      fVar142 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar94._20_4_);
      auVar109._20_4_ = fVar142;
      fVar152 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar94._24_4_);
      auVar109._24_4_ = fVar152;
      uVar75 = (uint)(byte)(uVar72 >> 7) * auVar94._28_4_;
      auVar109._28_4_ = uVar75;
      bVar15 = (bool)((byte)uVar72 & 1);
      auVar110._0_4_ = (float)((uint)bVar15 * auVar92._0_4_ | (uint)!bVar15 * auVar98._0_4_);
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar98._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar98._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar98._12_4_);
      bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar15 * auVar92._16_4_ | (uint)!bVar15 * auVar98._16_4_);
      bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar15 * auVar92._20_4_ | (uint)!bVar15 * auVar98._20_4_);
      bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar15 * auVar92._24_4_ | (uint)!bVar15 * auVar98._24_4_);
      bVar15 = SUB81(uVar72 >> 7,0);
      auVar110._28_4_ = (uint)bVar15 * auVar92._28_4_ | (uint)!bVar15 * auVar98._28_4_;
      auVar97 = vandps_avx(auVar207,ZEXT1632(auVar90));
      auVar95 = vandps_avx(auVar107,auVar207);
      auVar95 = vmaxps_avx(auVar97,auVar95);
      auVar97 = vandps_avx(auVar106,auVar207);
      auVar97 = vmaxps_avx(auVar95,auVar97);
      uVar72 = vcmpps_avx512vl(auVar97,auVar202,1);
      bVar15 = (bool)((byte)uVar72 & 1);
      auVar111._0_4_ = (float)((uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar90._0_4_);
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar90._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar90._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar90._12_4_);
      fVar154 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar94._16_4_);
      auVar111._16_4_ = fVar154;
      fVar172 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar94._20_4_);
      auVar111._20_4_ = fVar172;
      fVar153 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar94._24_4_);
      auVar111._24_4_ = fVar153;
      auVar111._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar94._28_4_;
      bVar15 = (bool)((byte)uVar72 & 1);
      auVar112._0_4_ = (float)((uint)bVar15 * auVar92._0_4_ | (uint)!bVar15 * auVar107._0_4_);
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar107._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar107._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar107._12_4_);
      bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar15 * auVar92._16_4_ | (uint)!bVar15 * auVar107._16_4_);
      bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar15 * auVar92._20_4_ | (uint)!bVar15 * auVar107._20_4_);
      bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar15 * auVar92._24_4_ | (uint)!bVar15 * auVar107._24_4_);
      bVar15 = SUB81(uVar72 >> 7,0);
      auVar112._28_4_ = (uint)bVar15 * auVar92._28_4_ | (uint)!bVar15 * auVar107._28_4_;
      auVar89 = vxorps_avx512vl(auVar91,auVar91);
      auVar97 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar89));
      auVar86 = vfmadd231ps_fma(auVar97,auVar110,auVar110);
      auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
      fVar84 = auVar97._0_4_;
      fVar85 = auVar97._4_4_;
      fVar160 = auVar97._8_4_;
      fVar134 = auVar97._12_4_;
      fVar135 = auVar97._16_4_;
      fVar136 = auVar97._20_4_;
      fVar138 = auVar97._24_4_;
      auVar38._4_4_ = fVar85 * fVar85 * fVar85 * auVar86._4_4_ * -0.5;
      auVar38._0_4_ = fVar84 * fVar84 * fVar84 * auVar86._0_4_ * -0.5;
      auVar38._8_4_ = fVar160 * fVar160 * fVar160 * auVar86._8_4_ * -0.5;
      auVar38._12_4_ = fVar134 * fVar134 * fVar134 * auVar86._12_4_ * -0.5;
      auVar38._16_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar38._20_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar38._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar38._28_4_ = 0;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar107 = vfmadd231ps_avx512vl(auVar38,auVar95,auVar97);
      auVar39._4_4_ = auVar110._4_4_ * auVar107._4_4_;
      auVar39._0_4_ = auVar110._0_4_ * auVar107._0_4_;
      auVar39._8_4_ = auVar110._8_4_ * auVar107._8_4_;
      auVar39._12_4_ = auVar110._12_4_ * auVar107._12_4_;
      auVar39._16_4_ = auVar110._16_4_ * auVar107._16_4_;
      auVar39._20_4_ = auVar110._20_4_ * auVar107._20_4_;
      auVar39._24_4_ = auVar110._24_4_ * auVar107._24_4_;
      auVar39._28_4_ = auVar97._28_4_;
      auVar40._4_4_ = auVar107._4_4_ * -auVar109._4_4_;
      auVar40._0_4_ = auVar107._0_4_ * -auVar109._0_4_;
      auVar40._8_4_ = auVar107._8_4_ * -auVar109._8_4_;
      auVar40._12_4_ = auVar107._12_4_ * -auVar109._12_4_;
      auVar40._16_4_ = auVar107._16_4_ * -fVar161;
      auVar40._20_4_ = auVar107._20_4_ * -fVar142;
      auVar40._24_4_ = auVar107._24_4_ * -fVar152;
      auVar40._28_4_ = uVar75 ^ 0x80000000;
      auVar97 = vmulps_avx512vl(auVar107,ZEXT1632(auVar89));
      auVar102 = ZEXT1632(auVar89);
      auVar106 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar102);
      auVar86 = vfmadd231ps_fma(auVar106,auVar112,auVar112);
      auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
      fVar161 = auVar106._0_4_;
      fVar142 = auVar106._4_4_;
      fVar152 = auVar106._8_4_;
      fVar84 = auVar106._12_4_;
      fVar85 = auVar106._16_4_;
      fVar160 = auVar106._20_4_;
      fVar134 = auVar106._24_4_;
      auVar41._4_4_ = fVar142 * fVar142 * fVar142 * auVar86._4_4_ * -0.5;
      auVar41._0_4_ = fVar161 * fVar161 * fVar161 * auVar86._0_4_ * -0.5;
      auVar41._8_4_ = fVar152 * fVar152 * fVar152 * auVar86._8_4_ * -0.5;
      auVar41._12_4_ = fVar84 * fVar84 * fVar84 * auVar86._12_4_ * -0.5;
      auVar41._16_4_ = fVar85 * fVar85 * fVar85 * -0.0;
      auVar41._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
      auVar41._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar41._28_4_ = 0;
      auVar95 = vfmadd231ps_avx512vl(auVar41,auVar95,auVar106);
      auVar42._4_4_ = auVar112._4_4_ * auVar95._4_4_;
      auVar42._0_4_ = auVar112._0_4_ * auVar95._0_4_;
      auVar42._8_4_ = auVar112._8_4_ * auVar95._8_4_;
      auVar42._12_4_ = auVar112._12_4_ * auVar95._12_4_;
      auVar42._16_4_ = auVar112._16_4_ * auVar95._16_4_;
      auVar42._20_4_ = auVar112._20_4_ * auVar95._20_4_;
      auVar42._24_4_ = auVar112._24_4_ * auVar95._24_4_;
      auVar42._28_4_ = auVar106._28_4_;
      auVar43._4_4_ = -auVar111._4_4_ * auVar95._4_4_;
      auVar43._0_4_ = -auVar111._0_4_ * auVar95._0_4_;
      auVar43._8_4_ = -auVar111._8_4_ * auVar95._8_4_;
      auVar43._12_4_ = -auVar111._12_4_ * auVar95._12_4_;
      auVar43._16_4_ = -fVar154 * auVar95._16_4_;
      auVar43._20_4_ = -fVar172 * auVar95._20_4_;
      auVar43._24_4_ = -fVar153 * auVar95._24_4_;
      auVar43._28_4_ = auVar107._28_4_;
      auVar95 = vmulps_avx512vl(auVar95,auVar102);
      auVar86 = vfmadd213ps_fma(auVar39,auVar93,auVar100);
      auVar87 = vfmadd213ps_fma(auVar40,auVar93,auVar101);
      auVar107 = vfmadd213ps_avx512vl(auVar97,auVar93,auVar99);
      auVar106 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar11),ZEXT1632(auVar9));
      auVar88 = vfnmadd213ps_fma(auVar39,auVar93,auVar100);
      auVar105 = ZEXT1632(auVar11);
      auVar90 = vfmadd213ps_fma(auVar43,auVar105,ZEXT1632(auVar10));
      auVar91 = vfnmadd213ps_fma(auVar40,auVar93,auVar101);
      auVar6 = vfmadd213ps_fma(auVar95,auVar105,auVar96);
      auVar98 = vfnmadd231ps_avx512vl(auVar99,auVar93,auVar97);
      auVar9 = vfnmadd213ps_fma(auVar42,auVar105,ZEXT1632(auVar9));
      auVar10 = vfnmadd213ps_fma(auVar43,auVar105,ZEXT1632(auVar10));
      auVar196 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar11),auVar95);
      auVar95 = vsubps_avx512vl(auVar106,ZEXT1632(auVar88));
      auVar97 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar91));
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar6),auVar98);
      auVar99 = vmulps_avx512vl(auVar97,auVar98);
      auVar7 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar91),auVar96);
      auVar44._4_4_ = auVar88._4_4_ * auVar96._4_4_;
      auVar44._0_4_ = auVar88._0_4_ * auVar96._0_4_;
      auVar44._8_4_ = auVar88._8_4_ * auVar96._8_4_;
      auVar44._12_4_ = auVar88._12_4_ * auVar96._12_4_;
      auVar44._16_4_ = auVar96._16_4_ * 0.0;
      auVar44._20_4_ = auVar96._20_4_ * 0.0;
      auVar44._24_4_ = auVar96._24_4_ * 0.0;
      auVar44._28_4_ = auVar96._28_4_;
      auVar96 = vfmsub231ps_avx512vl(auVar44,auVar98,auVar95);
      auVar45._4_4_ = auVar91._4_4_ * auVar95._4_4_;
      auVar45._0_4_ = auVar91._0_4_ * auVar95._0_4_;
      auVar45._8_4_ = auVar91._8_4_ * auVar95._8_4_;
      auVar45._12_4_ = auVar91._12_4_ * auVar95._12_4_;
      auVar45._16_4_ = auVar95._16_4_ * 0.0;
      auVar45._20_4_ = auVar95._20_4_ * 0.0;
      auVar45._24_4_ = auVar95._24_4_ * 0.0;
      auVar45._28_4_ = auVar95._28_4_;
      auVar8 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar88),auVar97);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar102,auVar96);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,ZEXT1632(auVar7));
      auVar94 = ZEXT1632(auVar89);
      uVar72 = vcmpps_avx512vl(auVar97,auVar94,2);
      bVar71 = (byte)uVar72;
      fVar84 = (float)((uint)(bVar71 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar9._0_4_
                      );
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar160 = (float)((uint)bVar15 * auVar86._4_4_ | (uint)!bVar15 * auVar9._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar135 = (float)((uint)bVar15 * auVar86._8_4_ | (uint)!bVar15 * auVar9._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar138 = (float)((uint)bVar15 * auVar86._12_4_ | (uint)!bVar15 * auVar9._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar160,fVar84))));
      fVar85 = (float)((uint)(bVar71 & 1) * auVar87._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar10._0_4_);
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar134 = (float)((uint)bVar15 * auVar87._4_4_ | (uint)!bVar15 * auVar10._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar136 = (float)((uint)bVar15 * auVar87._8_4_ | (uint)!bVar15 * auVar10._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar139 = (float)((uint)bVar15 * auVar87._12_4_ | (uint)!bVar15 * auVar10._12_4_);
      auVar105 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar85))));
      auVar113._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar196._0_4_)
      ;
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar196._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar196._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar196._12_4_);
      fVar142 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
      auVar113._16_4_ = fVar142;
      fVar161 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
      auVar113._20_4_ = fVar161;
      fVar152 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
      auVar113._24_4_ = fVar152;
      iVar1 = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
      auVar113._28_4_ = iVar1;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar106);
      auVar114._0_4_ = (uint)(bVar71 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar7._0_4_
      ;
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar7._4_4_;
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar7._8_4_;
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar7._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar95._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar95._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar95._24_4_;
      auVar114._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar90));
      auVar115._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar87._0_4_);
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar87._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar87._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar87._12_4_);
      fVar154 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar95._16_4_);
      auVar115._16_4_ = fVar154;
      fVar172 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar95._20_4_);
      auVar115._20_4_ = fVar172;
      fVar153 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar95._24_4_);
      auVar115._24_4_ = fVar153;
      auVar115._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar6));
      auVar116._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar107._0_4_);
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar107._4_4_);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar107._8_4_);
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar107._12_4_);
      bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar15 * auVar95._16_4_ | (uint)!bVar15 * auVar107._16_4_);
      bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar15 * auVar95._20_4_ | (uint)!bVar15 * auVar107._20_4_);
      bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar15 * auVar95._24_4_ | (uint)!bVar15 * auVar107._24_4_);
      bVar15 = SUB81(uVar72 >> 7,0);
      auVar116._28_4_ = (uint)bVar15 * auVar95._28_4_ | (uint)!bVar15 * auVar107._28_4_;
      auVar117._0_4_ =
           (uint)(bVar71 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar106._0_4_;
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar15 * (int)auVar88._4_4_ | (uint)!bVar15 * auVar106._4_4_;
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar15 * (int)auVar88._8_4_ | (uint)!bVar15 * auVar106._8_4_;
      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar15 * (int)auVar88._12_4_ | (uint)!bVar15 * auVar106._12_4_;
      auVar117._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar106._16_4_;
      auVar117._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar106._20_4_;
      auVar117._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar106._24_4_;
      auVar117._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar106._28_4_;
      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar118._0_4_ = (uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar6._0_4_
      ;
      bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar6._4_4_;
      bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar6._8_4_;
      bVar16 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar6._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar98._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar98._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar98._24_4_;
      iVar2 = (uint)(byte)(uVar72 >> 7) * auVar98._28_4_;
      auVar118._28_4_ = iVar2;
      auVar102 = vsubps_avx512vl(auVar117,auVar99);
      auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar91._12_4_ |
                                              (uint)!bVar18 * auVar90._12_4_,
                                              CONCAT48((uint)bVar17 * (int)auVar91._8_4_ |
                                                       (uint)!bVar17 * auVar90._8_4_,
                                                       CONCAT44((uint)bVar15 * (int)auVar91._4_4_ |
                                                                (uint)!bVar15 * auVar90._4_4_,
                                                                (uint)(bVar71 & 1) *
                                                                (int)auVar91._0_4_ |
                                                                (uint)!(bool)(bVar71 & 1) *
                                                                auVar90._0_4_)))),auVar105);
      auVar190 = ZEXT3264(auVar95);
      auVar107 = vsubps_avx(auVar118,auVar113);
      auVar106 = vsubps_avx(auVar99,auVar114);
      auVar194 = ZEXT3264(auVar106);
      auVar98 = vsubps_avx(auVar105,auVar115);
      auVar96 = vsubps_avx(auVar113,auVar116);
      auVar46._4_4_ = auVar107._4_4_ * fVar160;
      auVar46._0_4_ = auVar107._0_4_ * fVar84;
      auVar46._8_4_ = auVar107._8_4_ * fVar135;
      auVar46._12_4_ = auVar107._12_4_ * fVar138;
      auVar46._16_4_ = auVar107._16_4_ * 0.0;
      auVar46._20_4_ = auVar107._20_4_ * 0.0;
      auVar46._24_4_ = auVar107._24_4_ * 0.0;
      auVar46._28_4_ = iVar2;
      auVar86 = vfmsub231ps_fma(auVar46,auVar113,auVar102);
      auVar47._4_4_ = fVar134 * auVar102._4_4_;
      auVar47._0_4_ = fVar85 * auVar102._0_4_;
      auVar47._8_4_ = fVar136 * auVar102._8_4_;
      auVar47._12_4_ = fVar139 * auVar102._12_4_;
      auVar47._16_4_ = auVar102._16_4_ * 0.0;
      auVar47._20_4_ = auVar102._20_4_ * 0.0;
      auVar47._24_4_ = auVar102._24_4_ * 0.0;
      auVar47._28_4_ = auVar97._28_4_;
      auVar87 = vfmsub231ps_fma(auVar47,auVar99,auVar95);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar94,ZEXT1632(auVar86));
      auVar185._0_4_ = auVar95._0_4_ * auVar113._0_4_;
      auVar185._4_4_ = auVar95._4_4_ * auVar113._4_4_;
      auVar185._8_4_ = auVar95._8_4_ * auVar113._8_4_;
      auVar185._12_4_ = auVar95._12_4_ * auVar113._12_4_;
      auVar185._16_4_ = auVar95._16_4_ * fVar142;
      auVar185._20_4_ = auVar95._20_4_ * fVar161;
      auVar185._24_4_ = auVar95._24_4_ * fVar152;
      auVar185._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar185,auVar105,auVar107);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar94,ZEXT1632(auVar86));
      auVar97 = vmulps_avx512vl(auVar96,auVar114);
      auVar97 = vfmsub231ps_avx512vl(auVar97,auVar106,auVar116);
      auVar48._4_4_ = auVar98._4_4_ * auVar116._4_4_;
      auVar48._0_4_ = auVar98._0_4_ * auVar116._0_4_;
      auVar48._8_4_ = auVar98._8_4_ * auVar116._8_4_;
      auVar48._12_4_ = auVar98._12_4_ * auVar116._12_4_;
      auVar48._16_4_ = auVar98._16_4_ * auVar116._16_4_;
      auVar48._20_4_ = auVar98._20_4_ * auVar116._20_4_;
      auVar48._24_4_ = auVar98._24_4_ * auVar116._24_4_;
      auVar48._28_4_ = auVar116._28_4_;
      auVar86 = vfmsub231ps_fma(auVar48,auVar115,auVar96);
      auVar186._0_4_ = auVar115._0_4_ * auVar106._0_4_;
      auVar186._4_4_ = auVar115._4_4_ * auVar106._4_4_;
      auVar186._8_4_ = auVar115._8_4_ * auVar106._8_4_;
      auVar186._12_4_ = auVar115._12_4_ * auVar106._12_4_;
      auVar186._16_4_ = fVar154 * auVar106._16_4_;
      auVar186._20_4_ = fVar172 * auVar106._20_4_;
      auVar186._24_4_ = fVar153 * auVar106._24_4_;
      auVar186._28_4_ = 0;
      auVar87 = vfmsub231ps_fma(auVar186,auVar98,auVar114);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar94,auVar97);
      auVar101 = vfmadd231ps_avx512vl(auVar97,auVar94,ZEXT1632(auVar86));
      auVar189 = ZEXT3264(auVar101);
      auVar97 = vmaxps_avx(auVar100,auVar101);
      uVar155 = vcmpps_avx512vl(auVar97,auVar94,2);
      bVar82 = bVar82 & (byte)uVar155;
      if (bVar82 != 0) {
        auVar49._4_4_ = auVar96._4_4_ * auVar95._4_4_;
        auVar49._0_4_ = auVar96._0_4_ * auVar95._0_4_;
        auVar49._8_4_ = auVar96._8_4_ * auVar95._8_4_;
        auVar49._12_4_ = auVar96._12_4_ * auVar95._12_4_;
        auVar49._16_4_ = auVar96._16_4_ * auVar95._16_4_;
        auVar49._20_4_ = auVar96._20_4_ * auVar95._20_4_;
        auVar49._24_4_ = auVar96._24_4_ * auVar95._24_4_;
        auVar49._28_4_ = auVar97._28_4_;
        auVar6 = vfmsub231ps_fma(auVar49,auVar98,auVar107);
        auVar50._4_4_ = auVar107._4_4_ * auVar106._4_4_;
        auVar50._0_4_ = auVar107._0_4_ * auVar106._0_4_;
        auVar50._8_4_ = auVar107._8_4_ * auVar106._8_4_;
        auVar50._12_4_ = auVar107._12_4_ * auVar106._12_4_;
        auVar50._16_4_ = auVar107._16_4_ * auVar106._16_4_;
        auVar50._20_4_ = auVar107._20_4_ * auVar106._20_4_;
        auVar50._24_4_ = auVar107._24_4_ * auVar106._24_4_;
        auVar50._28_4_ = auVar107._28_4_;
        auVar90 = vfmsub231ps_fma(auVar50,auVar102,auVar96);
        auVar51._4_4_ = auVar98._4_4_ * auVar102._4_4_;
        auVar51._0_4_ = auVar98._0_4_ * auVar102._0_4_;
        auVar51._8_4_ = auVar98._8_4_ * auVar102._8_4_;
        auVar51._12_4_ = auVar98._12_4_ * auVar102._12_4_;
        auVar51._16_4_ = auVar98._16_4_ * auVar102._16_4_;
        auVar51._20_4_ = auVar98._20_4_ * auVar102._20_4_;
        auVar51._24_4_ = auVar98._24_4_ * auVar102._24_4_;
        auVar51._28_4_ = auVar98._28_4_;
        auVar7 = vfmsub231ps_fma(auVar51,auVar106,auVar95);
        auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar7));
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar6),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar97 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
        auVar194 = ZEXT3264(auVar97);
        auVar26._8_4_ = 0x3f800000;
        auVar26._0_8_ = 0x3f8000003f800000;
        auVar26._12_4_ = 0x3f800000;
        auVar26._16_4_ = 0x3f800000;
        auVar26._20_4_ = 0x3f800000;
        auVar26._24_4_ = 0x3f800000;
        auVar26._28_4_ = 0x3f800000;
        auVar95 = vfnmadd213ps_avx512vl(auVar97,ZEXT1632(auVar87),auVar26);
        auVar86 = vfmadd132ps_fma(auVar95,auVar97,auVar97);
        auVar190 = ZEXT1664(auVar86);
        auVar52._4_4_ = auVar7._4_4_ * auVar113._4_4_;
        auVar52._0_4_ = auVar7._0_4_ * auVar113._0_4_;
        auVar52._8_4_ = auVar7._8_4_ * auVar113._8_4_;
        auVar52._12_4_ = auVar7._12_4_ * auVar113._12_4_;
        auVar52._16_4_ = fVar142 * 0.0;
        auVar52._20_4_ = fVar161 * 0.0;
        auVar52._24_4_ = fVar152 * 0.0;
        auVar52._28_4_ = iVar1;
        auVar90 = vfmadd231ps_fma(auVar52,auVar105,ZEXT1632(auVar90));
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar99,ZEXT1632(auVar6));
        fVar142 = auVar86._0_4_;
        fVar152 = auVar86._4_4_;
        fVar153 = auVar86._8_4_;
        fVar154 = auVar86._12_4_;
        local_280 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar154,
                                       CONCAT48(auVar90._8_4_ * fVar153,
                                                CONCAT44(auVar90._4_4_ * fVar152,
                                                         auVar90._0_4_ * fVar142))));
        auVar197 = ZEXT3264(local_280);
        auVar145._8_4_ = 3;
        auVar145._0_8_ = 0x300000003;
        auVar145._12_4_ = 3;
        auVar145._16_4_ = 3;
        auVar145._20_4_ = 3;
        auVar145._24_4_ = 3;
        auVar145._28_4_ = 3;
        auVar97 = vpermps_avx2(auVar145,ZEXT1632((undefined1  [16])aVar3));
        uVar155 = vcmpps_avx512vl(auVar97,local_280,2);
        fVar161 = (ray->super_RayK<1>).tfar;
        auVar27._4_4_ = fVar161;
        auVar27._0_4_ = fVar161;
        auVar27._8_4_ = fVar161;
        auVar27._12_4_ = fVar161;
        auVar27._16_4_ = fVar161;
        auVar27._20_4_ = fVar161;
        auVar27._24_4_ = fVar161;
        auVar27._28_4_ = fVar161;
        uVar21 = vcmpps_avx512vl(local_280,auVar27,2);
        bVar82 = (byte)uVar155 & (byte)uVar21 & bVar82;
        if (bVar82 != 0) {
          uVar83 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar83 = bVar82 & uVar83;
          if ((char)uVar83 != '\0') {
            fVar161 = auVar100._0_4_ * fVar142;
            fVar172 = auVar100._4_4_ * fVar152;
            auVar53._4_4_ = fVar172;
            auVar53._0_4_ = fVar161;
            fVar84 = auVar100._8_4_ * fVar153;
            auVar53._8_4_ = fVar84;
            fVar85 = auVar100._12_4_ * fVar154;
            auVar53._12_4_ = fVar85;
            fVar160 = auVar100._16_4_ * 0.0;
            auVar53._16_4_ = fVar160;
            fVar134 = auVar100._20_4_ * 0.0;
            auVar53._20_4_ = fVar134;
            fVar135 = auVar100._24_4_ * 0.0;
            auVar53._24_4_ = fVar135;
            auVar53._28_4_ = auVar100._28_4_;
            auVar146._8_4_ = 0x3f800000;
            auVar146._0_8_ = 0x3f8000003f800000;
            auVar146._12_4_ = 0x3f800000;
            auVar146._16_4_ = 0x3f800000;
            auVar146._20_4_ = 0x3f800000;
            auVar146._24_4_ = 0x3f800000;
            auVar146._28_4_ = 0x3f800000;
            auVar97 = vsubps_avx(auVar146,auVar53);
            local_2c0._0_4_ =
                 (float)((uint)(bVar71 & 1) * (int)fVar161 |
                        (uint)!(bool)(bVar71 & 1) * auVar97._0_4_);
            bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar15 * (int)fVar172 | (uint)!bVar15 * auVar97._4_4_);
            bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar15 * (int)fVar84 | (uint)!bVar15 * auVar97._8_4_);
            bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar15 * (int)fVar85 | (uint)!bVar15 * auVar97._12_4_);
            bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
            local_2c0._16_4_ = (float)((uint)bVar15 * (int)fVar160 | (uint)!bVar15 * auVar97._16_4_)
            ;
            bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
            local_2c0._20_4_ = (float)((uint)bVar15 * (int)fVar134 | (uint)!bVar15 * auVar97._20_4_)
            ;
            bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
            local_2c0._24_4_ = (float)((uint)bVar15 * (int)fVar135 | (uint)!bVar15 * auVar97._24_4_)
            ;
            bVar15 = SUB81(uVar72 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar97._28_4_);
            auVar97 = vsubps_avx(ZEXT1632(auVar11),auVar93);
            auVar86 = vfmadd213ps_fma(auVar97,local_2c0,auVar93);
            fVar161 = pre->depth_scale;
            auVar28._4_4_ = fVar161;
            auVar28._0_4_ = fVar161;
            auVar28._8_4_ = fVar161;
            auVar28._12_4_ = fVar161;
            auVar28._16_4_ = fVar161;
            auVar28._20_4_ = fVar161;
            auVar28._24_4_ = fVar161;
            auVar28._28_4_ = fVar161;
            auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                         CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                  CONCAT44(auVar86._4_4_ +
                                                                           auVar86._4_4_,
                                                                           auVar86._0_4_ +
                                                                           auVar86._0_4_)))),auVar28
                                     );
            uVar76 = vcmpps_avx512vl(local_280,auVar97,6);
            uVar83 = uVar83 & uVar76;
            bVar82 = (byte)uVar83;
            if (bVar82 != 0) {
              auVar170._0_4_ = auVar101._0_4_ * fVar142;
              auVar170._4_4_ = auVar101._4_4_ * fVar152;
              auVar170._8_4_ = auVar101._8_4_ * fVar153;
              auVar170._12_4_ = auVar101._12_4_ * fVar154;
              auVar170._16_4_ = auVar101._16_4_ * 0.0;
              auVar170._20_4_ = auVar101._20_4_ * 0.0;
              auVar170._24_4_ = auVar101._24_4_ * 0.0;
              auVar170._28_4_ = 0;
              auVar173._8_4_ = 0x3f800000;
              auVar173._0_8_ = 0x3f8000003f800000;
              auVar173._12_4_ = 0x3f800000;
              auVar173._16_4_ = 0x3f800000;
              auVar173._20_4_ = 0x3f800000;
              auVar173._24_4_ = 0x3f800000;
              auVar173._28_4_ = 0x3f800000;
              auVar97 = vsubps_avx(auVar173,auVar170);
              auVar119._0_4_ =
                   (uint)(bVar71 & 1) * (int)auVar170._0_4_ |
                   (uint)!(bool)(bVar71 & 1) * auVar97._0_4_;
              bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar15 * (int)auVar170._4_4_ | (uint)!bVar15 * auVar97._4_4_;
              bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar15 * (int)auVar170._8_4_ | (uint)!bVar15 * auVar97._8_4_;
              bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar119._12_4_ = (uint)bVar15 * (int)auVar170._12_4_ | (uint)!bVar15 * auVar97._12_4_
              ;
              bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar119._16_4_ = (uint)bVar15 * (int)auVar170._16_4_ | (uint)!bVar15 * auVar97._16_4_
              ;
              bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar119._20_4_ = (uint)bVar15 * (int)auVar170._20_4_ | (uint)!bVar15 * auVar97._20_4_
              ;
              bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar119._24_4_ = (uint)bVar15 * (int)auVar170._24_4_ | (uint)!bVar15 * auVar97._24_4_
              ;
              auVar119._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar97._28_4_;
              auVar29._8_4_ = 0x40000000;
              auVar29._0_8_ = 0x4000000040000000;
              auVar29._12_4_ = 0x40000000;
              auVar29._16_4_ = 0x40000000;
              auVar29._20_4_ = 0x40000000;
              auVar29._24_4_ = 0x40000000;
              auVar29._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar119,auVar173,auVar29);
              local_260 = 0;
              local_25c = iVar13;
              auVar194 = ZEXT1664(local_4e0);
              local_250 = local_4e0;
              local_240 = local_4b0._0_8_;
              uStack_238 = local_4b0._8_8_;
              local_230 = local_4c0._0_8_;
              uStack_228 = local_4c0._8_8_;
              local_220 = local_4d0;
              uStack_218 = uStack_4c8;
              if ((pGVar77->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar161 = 1.0 / auVar203._0_4_;
                local_200[0] = fVar161 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar161 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar161 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar161 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar161 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar161 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar161 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = local_280;
                auVar147._8_4_ = 0x7f800000;
                auVar147._0_8_ = 0x7f8000007f800000;
                auVar147._12_4_ = 0x7f800000;
                auVar147._16_4_ = 0x7f800000;
                auVar147._20_4_ = 0x7f800000;
                auVar147._24_4_ = 0x7f800000;
                auVar147._28_4_ = 0x7f800000;
                auVar97 = vblendmps_avx512vl(auVar147,local_280);
                auVar120._0_4_ =
                     (uint)(bVar82 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                bVar15 = (bool)((byte)(uVar83 >> 1) & 1);
                auVar120._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                auVar120._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                auVar120._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar83 >> 4) & 1);
                auVar120._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                auVar120._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                auVar120._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = SUB81(uVar83 >> 7,0);
                auVar120._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * 0x7f800000;
                auVar97 = vshufps_avx(auVar120,auVar120,0xb1);
                auVar97 = vminps_avx(auVar120,auVar97);
                auVar95 = vshufpd_avx(auVar97,auVar97,5);
                auVar97 = vminps_avx(auVar97,auVar95);
                auVar95 = vpermpd_avx2(auVar97,0x4e);
                auVar97 = vminps_avx(auVar97,auVar95);
                uVar155 = vcmpps_avx512vl(auVar120,auVar97,0);
                uVar75 = (uint)uVar83;
                if ((bVar82 & (byte)uVar155) != 0) {
                  uVar75 = (uint)(bVar82 & (byte)uVar155);
                }
                uVar74 = 0;
                for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                  uVar74 = uVar74 + 1;
                }
                uVar72 = (ulong)uVar74;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_440 = local_280;
                  local_460 = auVar103;
                  do {
                    local_484 = local_200[uVar72];
                    local_480 = *(undefined4 *)(local_1e0 + uVar72 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar72 * 4);
                    local_518.context = context->user;
                    fVar161 = 1.0 - local_484;
                    auVar25._8_4_ = 0x80000000;
                    auVar25._0_8_ = 0x8000000080000000;
                    auVar25._12_4_ = 0x80000000;
                    auVar90 = vxorps_avx512vl(ZEXT416((uint)fVar161),auVar25);
                    auVar86 = ZEXT416((uint)(local_484 * fVar161 * 4.0));
                    auVar87 = vfnmsub213ss_fma(ZEXT416((uint)local_484),ZEXT416((uint)local_484),
                                               auVar86);
                    auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),auVar86)
                    ;
                    fVar161 = fVar161 * auVar90._0_4_ * 0.5;
                    fVar142 = auVar87._0_4_ * 0.5;
                    auVar190 = ZEXT464((uint)fVar142);
                    fVar152 = auVar86._0_4_ * 0.5;
                    fVar153 = local_484 * local_484 * 0.5;
                    auVar182._0_4_ = fVar153 * (float)local_4d0._0_4_;
                    auVar182._4_4_ = fVar153 * (float)local_4d0._4_4_;
                    auVar182._8_4_ = fVar153 * (float)uStack_4c8;
                    auVar182._12_4_ = fVar153 * uStack_4c8._4_4_;
                    auVar168._4_4_ = fVar152;
                    auVar168._0_4_ = fVar152;
                    auVar168._8_4_ = fVar152;
                    auVar168._12_4_ = fVar152;
                    auVar86 = vfmadd132ps_fma(auVar168,auVar182,local_4c0);
                    auVar183._4_4_ = fVar142;
                    auVar183._0_4_ = fVar142;
                    auVar183._8_4_ = fVar142;
                    auVar183._12_4_ = fVar142;
                    auVar86 = vfmadd132ps_fma(auVar183,auVar86,local_4b0);
                    auVar189 = ZEXT1664(auVar86);
                    auVar169._4_4_ = fVar161;
                    auVar169._0_4_ = fVar161;
                    auVar169._8_4_ = fVar161;
                    auVar169._12_4_ = fVar161;
                    auVar87 = vfmadd213ps_fma(auVar169,auVar194._0_16_,auVar86);
                    local_490 = vmovlps_avx(auVar87);
                    local_488 = vextractps_avx(auVar87,2);
                    local_47c = uVar12;
                    local_478 = (int)local_550;
                    local_474 = (local_518.context)->instID[0];
                    local_470 = (local_518.context)->instPrimID[0];
                    local_554 = -1;
                    local_518.valid = &local_554;
                    local_518.geometryUserPtr = pGVar77->userPtr;
                    local_518.ray = (RTCRayN *)ray;
                    local_518.hit = (RTCHitN *)&local_490;
                    local_518.N = 1;
                    if (pGVar77->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019e6013:
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar189 = ZEXT1664(auVar189._0_16_);
                        auVar190 = ZEXT1664(auVar190._0_16_);
                        (*p_Var14)(&local_518);
                        auVar197 = ZEXT3264(local_440);
                        auVar209 = ZEXT3264(local_460);
                        auVar194 = ZEXT1664(local_4e0);
                        auVar212 = ZEXT464(0x35000000);
                        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar211 = ZEXT1664(auVar86);
                        auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar210 = ZEXT3264(auVar97);
                        ray = local_540;
                        context = local_548;
                        if (*local_518.valid == 0) goto LAB_019e60d7;
                      }
                      (((Vec3f *)((long)local_518.ray + 0x30))->field_0).components[0] =
                           *(float *)local_518.hit;
                      (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_518.hit + 4);
                      (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_518.hit + 8);
                      *(float *)((long)local_518.ray + 0x3c) = *(float *)(local_518.hit + 0xc);
                      *(float *)((long)local_518.ray + 0x40) = *(float *)(local_518.hit + 0x10);
                      *(float *)((long)local_518.ray + 0x44) = *(float *)(local_518.hit + 0x14);
                      *(float *)((long)local_518.ray + 0x48) = *(float *)(local_518.hit + 0x18);
                      *(float *)((long)local_518.ray + 0x4c) = *(float *)(local_518.hit + 0x1c);
                      *(float *)((long)local_518.ray + 0x50) = *(float *)(local_518.hit + 0x20);
                    }
                    else {
                      auVar189 = ZEXT1664(auVar86);
                      auVar190 = ZEXT464((uint)fVar142);
                      (*pGVar77->intersectionFilterN)(&local_518);
                      auVar197 = ZEXT3264(local_440);
                      auVar209 = ZEXT3264(local_460);
                      auVar194 = ZEXT1664(local_4e0);
                      auVar212 = ZEXT464(0x35000000);
                      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar211 = ZEXT1664(auVar86);
                      auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar210 = ZEXT3264(auVar97);
                      ray = local_540;
                      context = local_548;
                      if (*local_518.valid != 0) goto LAB_019e6013;
LAB_019e60d7:
                      auVar212 = ZEXT464(0x35000000);
                      (local_540->super_RayK<1>).tfar = (float)local_400._0_4_;
                      ray = local_540;
                      context = local_548;
                    }
                    auVar103 = auVar209._0_32_;
                    bVar82 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar83;
                    fVar161 = (ray->super_RayK<1>).tfar;
                    auVar36._4_4_ = fVar161;
                    auVar36._0_4_ = fVar161;
                    auVar36._8_4_ = fVar161;
                    auVar36._12_4_ = fVar161;
                    auVar36._16_4_ = fVar161;
                    auVar36._20_4_ = fVar161;
                    auVar36._24_4_ = fVar161;
                    auVar36._28_4_ = fVar161;
                    uVar155 = vcmpps_avx512vl(auVar197._0_32_,auVar36,2);
                    pre = local_538;
                    prim = local_528;
                    pPVar79 = local_530;
                    if ((bVar82 & (byte)uVar155) == 0) goto LAB_019e51fc;
                    local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar82 = bVar82 & (byte)uVar155;
                    uVar83 = (ulong)bVar82;
                    auVar151._8_4_ = 0x7f800000;
                    auVar151._0_8_ = 0x7f8000007f800000;
                    auVar151._12_4_ = 0x7f800000;
                    auVar151._16_4_ = 0x7f800000;
                    auVar151._20_4_ = 0x7f800000;
                    auVar151._24_4_ = 0x7f800000;
                    auVar151._28_4_ = 0x7f800000;
                    auVar97 = vblendmps_avx512vl(auVar151,auVar197._0_32_);
                    auVar133._0_4_ =
                         (uint)(bVar82 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)(bVar82 >> 1 & 1);
                    auVar133._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar82 >> 2 & 1);
                    auVar133._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar82 >> 3 & 1);
                    auVar133._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar82 >> 4 & 1);
                    auVar133._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar82 >> 5 & 1);
                    auVar133._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar82 >> 6 & 1);
                    auVar133._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar133._28_4_ =
                         (uint)(bVar82 >> 7) * auVar97._28_4_ |
                         (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                    auVar97 = vshufps_avx(auVar133,auVar133,0xb1);
                    auVar97 = vminps_avx(auVar133,auVar97);
                    auVar95 = vshufpd_avx(auVar97,auVar97,5);
                    auVar97 = vminps_avx(auVar97,auVar95);
                    auVar95 = vpermpd_avx2(auVar97,0x4e);
                    auVar97 = vminps_avx(auVar97,auVar95);
                    uVar155 = vcmpps_avx512vl(auVar133,auVar97,0);
                    bVar71 = (byte)uVar155 & bVar82;
                    if (bVar71 != 0) {
                      bVar82 = bVar71;
                    }
                    uVar73 = 0;
                    for (uVar75 = (uint)bVar82; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000
                        ) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar72 = (ulong)uVar73;
                  } while( true );
                }
                fVar161 = local_200[uVar72];
                fVar142 = *(float *)(local_1e0 + uVar72 * 4);
                fVar152 = 1.0 - fVar161;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar90 = vxorps_avx512vl(ZEXT416((uint)fVar152),auVar22);
                auVar86 = ZEXT416((uint)(fVar161 * fVar152 * 4.0));
                auVar87 = vfnmsub213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),auVar86);
                auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),auVar86);
                fVar152 = fVar152 * auVar90._0_4_ * 0.5;
                fVar153 = auVar87._0_4_ * 0.5;
                auVar190 = ZEXT464((uint)fVar153);
                fVar154 = auVar86._0_4_ * 0.5;
                fVar172 = fVar161 * fVar161 * 0.5;
                auVar176._0_4_ = fVar172 * (float)local_4d0._0_4_;
                auVar176._4_4_ = fVar172 * (float)local_4d0._4_4_;
                auVar176._8_4_ = fVar172 * (float)uStack_4c8;
                auVar176._12_4_ = fVar172 * uStack_4c8._4_4_;
                auVar162._4_4_ = fVar154;
                auVar162._0_4_ = fVar154;
                auVar162._8_4_ = fVar154;
                auVar162._12_4_ = fVar154;
                auVar86 = vfmadd132ps_fma(auVar162,auVar176,local_4c0);
                auVar177._4_4_ = fVar153;
                auVar177._0_4_ = fVar153;
                auVar177._8_4_ = fVar153;
                auVar177._12_4_ = fVar153;
                auVar86 = vfmadd132ps_fma(auVar177,auVar86,local_4b0);
                auVar189 = ZEXT1664(auVar86);
                auVar163._4_4_ = fVar152;
                auVar163._0_4_ = fVar152;
                auVar163._8_4_ = fVar152;
                auVar163._12_4_ = fVar152;
                (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar72 * 4);
                auVar86 = vfmadd213ps_fma(auVar163,local_4e0,auVar86);
                uVar155 = vmovlps_avx(auVar86);
                *(undefined8 *)&(ray->Ng).field_0 = uVar155;
                fVar152 = (float)vextractps_avx(auVar86,2);
                (ray->Ng).field_0.field_0.z = fVar152;
                ray->u = fVar161;
                ray->v = fVar142;
                ray->primID = uVar12;
                ray->geomID = uVar73;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pre = local_538;
                prim = local_528;
                pPVar79 = local_530;
              }
            }
          }
        }
      }
    }
LAB_019e51fc:
    if (8 < iVar13) {
      auVar97 = vpbroadcastd_avx512vl();
      auVar209 = ZEXT3264(auVar97);
      local_400._4_4_ = local_420._0_4_;
      local_400._0_4_ = local_420._0_4_;
      local_400._8_4_ = local_420._0_4_;
      local_400._12_4_ = local_420._0_4_;
      local_400._16_4_ = local_420._0_4_;
      local_400._20_4_ = local_420._0_4_;
      local_400._24_4_ = local_420._0_4_;
      local_400._28_4_ = local_420._0_4_;
      auVar148._8_4_ = 3;
      auVar148._0_8_ = 0x300000003;
      auVar148._12_4_ = 3;
      auVar148._16_4_ = 3;
      auVar148._20_4_ = 3;
      auVar148._24_4_ = 3;
      auVar148._28_4_ = 3;
      local_3e0 = vpermps_avx2(auVar148,local_3e0);
      local_120 = 1.0 / (float)local_4a0._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar81 = 8;
      local_460 = auVar103;
LAB_019e528b:
      if (lVar81 < local_520) {
        auVar97 = vpbroadcastd_avx512vl();
        auVar97 = vpor_avx2(auVar97,_DAT_01fb4ba0);
        uVar21 = vpcmpgtd_avx512vl(auVar209._0_32_,auVar97);
        auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 * 4 + lVar80);
        auVar95 = *(undefined1 (*) [32])(lVar80 + 0x21fffac + lVar81 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar80 + 0x2200430 + lVar81 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar80 + 0x22008b4 + lVar81 * 4);
        auVar197._0_4_ = auVar106._0_4_ * (float)local_3a0._0_4_;
        auVar197._4_4_ = auVar106._4_4_ * (float)local_3a0._4_4_;
        auVar197._8_4_ = auVar106._8_4_ * fStack_398;
        auVar197._12_4_ = auVar106._12_4_ * fStack_394;
        auVar197._16_4_ = auVar106._16_4_ * fStack_390;
        auVar197._20_4_ = auVar106._20_4_ * fStack_38c;
        auVar197._28_36_ = auVar190._28_36_;
        auVar197._24_4_ = auVar106._24_4_ * fStack_388;
        auVar190._0_4_ = auVar106._0_4_ * (float)local_3c0._0_4_;
        auVar190._4_4_ = auVar106._4_4_ * (float)local_3c0._4_4_;
        auVar190._8_4_ = auVar106._8_4_ * fStack_3b8;
        auVar190._12_4_ = auVar106._12_4_ * fStack_3b4;
        auVar190._16_4_ = auVar106._16_4_ * fStack_3b0;
        auVar190._20_4_ = auVar106._20_4_ * fStack_3ac;
        auVar190._28_36_ = auVar189._28_36_;
        auVar190._24_4_ = auVar106._24_4_ * fStack_3a8;
        auVar98 = vmulps_avx512vl(local_100,auVar106);
        auVar96 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar107,local_360);
        auVar99 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar107,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_e0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,local_320);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar98,auVar95,local_c0);
        auVar86 = vfmadd231ps_fma(auVar96,auVar97,local_2e0);
        auVar190 = ZEXT1664(auVar86);
        auVar87 = vfmadd231ps_fma(auVar99,auVar97,local_300);
        auVar189 = ZEXT1664(auVar87);
        auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 * 4 + lVar80);
        auVar96 = *(undefined1 (*) [32])(lVar80 + 0x22023cc + lVar81 * 4);
        auVar101 = vfmadd231ps_avx512vl(auVar105,auVar97,local_a0);
        auVar99 = *(undefined1 (*) [32])(lVar80 + 0x2202850 + lVar81 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar80 + 0x2202cd4 + lVar81 * 4);
        auVar195._0_4_ = auVar105._0_4_ * (float)local_3a0._0_4_;
        auVar195._4_4_ = auVar105._4_4_ * (float)local_3a0._4_4_;
        auVar195._8_4_ = auVar105._8_4_ * fStack_398;
        auVar195._12_4_ = auVar105._12_4_ * fStack_394;
        auVar195._16_4_ = auVar105._16_4_ * fStack_390;
        auVar195._20_4_ = auVar105._20_4_ * fStack_38c;
        auVar195._28_36_ = auVar194._28_36_;
        auVar195._24_4_ = auVar105._24_4_ * fStack_388;
        auVar54._4_4_ = auVar105._4_4_ * (float)local_3c0._4_4_;
        auVar54._0_4_ = auVar105._0_4_ * (float)local_3c0._0_4_;
        auVar54._8_4_ = auVar105._8_4_ * fStack_3b8;
        auVar54._12_4_ = auVar105._12_4_ * fStack_3b4;
        auVar54._16_4_ = auVar105._16_4_ * fStack_3b0;
        auVar54._20_4_ = auVar105._20_4_ * fStack_3ac;
        auVar54._24_4_ = auVar105._24_4_ * fStack_3a8;
        auVar54._28_4_ = uStack_3a4;
        auVar102 = vmulps_avx512vl(local_100,auVar105);
        auVar100 = vfmadd231ps_avx512vl(auVar195._0_32_,auVar99,local_360);
        auVar94 = vfmadd231ps_avx512vl(auVar54,auVar99,local_380);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,local_e0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_320);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,local_340);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,local_c0);
        auVar90 = vfmadd231ps_fma(auVar100,auVar98,local_2e0);
        auVar194 = ZEXT1664(auVar90);
        auVar6 = vfmadd231ps_fma(auVar94,auVar98,local_300);
        auVar94 = vfmadd231ps_avx512vl(auVar102,auVar98,local_a0);
        auVar92 = vmaxps_avx512vl(auVar101,auVar94);
        auVar102 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar86));
        auVar100 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar87));
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar87),auVar102);
        auVar103 = vmulps_avx512vl(ZEXT1632(auVar86),auVar100);
        auVar93 = vsubps_avx512vl(auVar93,auVar103);
        auVar103 = vmulps_avx512vl(auVar100,auVar100);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
        auVar92 = vmulps_avx512vl(auVar92,auVar92);
        auVar92 = vmulps_avx512vl(auVar92,auVar103);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        uVar155 = vcmpps_avx512vl(auVar93,auVar92,2);
        bVar82 = (byte)uVar21 & (byte)uVar155;
        if (bVar82 != 0) {
          auVar105 = vmulps_avx512vl(local_1a0,auVar105);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_180,auVar105);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar99);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_460,auVar96);
          auVar106 = vmulps_avx512vl(local_1a0,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar106);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar107);
          auVar96 = vfmadd213ps_avx512vl(auVar97,local_460,auVar95);
          auVar97 = *(undefined1 (*) [32])(lVar80 + 0x2200d38 + lVar81 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar80 + 0x22011bc + lVar81 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar80 + 0x2201640 + lVar81 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar80 + 0x2201ac4 + lVar81 * 4);
          auVar99 = vmulps_avx512vl(_local_3a0,auVar106);
          auVar105 = vmulps_avx512vl(_local_3c0,auVar106);
          auVar106 = vmulps_avx512vl(local_1a0,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_360);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_380);
          auVar107 = vfmadd231ps_avx512vl(auVar106,local_180,auVar107);
          auVar106 = vfmadd231ps_avx512vl(auVar99,auVar95,local_320);
          auVar99 = vfmadd231ps_avx512vl(auVar105,auVar95,local_340);
          auVar95 = vfmadd231ps_avx512vl(auVar107,local_160,auVar95);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,local_2e0);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_300);
          auVar7 = vfmadd231ps_fma(auVar95,auVar97,local_460);
          auVar97 = *(undefined1 (*) [32])(lVar80 + 0x2203158 + lVar81 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar80 + 0x2203a60 + lVar81 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar80 + 0x2203ee4 + lVar81 * 4);
          auVar105 = vmulps_avx512vl(_local_3a0,auVar107);
          auVar92 = vmulps_avx512vl(_local_3c0,auVar107);
          auVar107 = vmulps_avx512vl(local_1a0,auVar107);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar95,local_360);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,local_380);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_180,auVar95);
          auVar95 = *(undefined1 (*) [32])(lVar80 + 0x22035dc + lVar81 * 4);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar95,local_320);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,local_340);
          auVar95 = vfmadd231ps_avx512vl(auVar107,local_160,auVar95);
          auVar107 = vfmadd231ps_avx512vl(auVar105,auVar97,local_2e0);
          auVar105 = vfmadd231ps_avx512vl(auVar92,auVar97,local_300);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_460,auVar97);
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar106,auVar92);
          vandps_avx512vl(auVar99,auVar92);
          auVar97 = vmaxps_avx(auVar92,auVar92);
          vandps_avx512vl(ZEXT1632(auVar7),auVar92);
          auVar97 = vmaxps_avx(auVar97,auVar92);
          uVar72 = vcmpps_avx512vl(auVar97,local_400,1);
          bVar15 = (bool)((byte)uVar72 & 1);
          auVar121._0_4_ = (float)((uint)bVar15 * auVar102._0_4_ | (uint)!bVar15 * auVar106._0_4_);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar106._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar106._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar121._12_4_ =
               (float)((uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar106._12_4_);
          bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar121._16_4_ =
               (float)((uint)bVar15 * auVar102._16_4_ | (uint)!bVar15 * auVar106._16_4_);
          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar121._20_4_ =
               (float)((uint)bVar15 * auVar102._20_4_ | (uint)!bVar15 * auVar106._20_4_);
          bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar121._24_4_ =
               (float)((uint)bVar15 * auVar102._24_4_ | (uint)!bVar15 * auVar106._24_4_);
          bVar15 = SUB81(uVar72 >> 7,0);
          auVar121._28_4_ = (uint)bVar15 * auVar102._28_4_ | (uint)!bVar15 * auVar106._28_4_;
          bVar15 = (bool)((byte)uVar72 & 1);
          auVar122._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar99._0_4_);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar99._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar99._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar99._12_4_)
          ;
          bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar99._16_4_)
          ;
          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar99._20_4_)
          ;
          bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar99._24_4_)
          ;
          bVar15 = SUB81(uVar72 >> 7,0);
          auVar122._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar99._28_4_;
          vandps_avx512vl(auVar107,auVar92);
          vandps_avx512vl(auVar105,auVar92);
          auVar97 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar95,auVar92);
          auVar97 = vmaxps_avx(auVar97,auVar122);
          uVar72 = vcmpps_avx512vl(auVar97,local_400,1);
          bVar15 = (bool)((byte)uVar72 & 1);
          auVar123._0_4_ = (uint)bVar15 * auVar102._0_4_ | (uint)!bVar15 * auVar107._0_4_;
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar107._4_4_;
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar107._8_4_;
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar107._12_4_;
          bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar15 * auVar102._16_4_ | (uint)!bVar15 * auVar107._16_4_;
          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar15 * auVar102._20_4_ | (uint)!bVar15 * auVar107._20_4_;
          bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar15 * auVar102._24_4_ | (uint)!bVar15 * auVar107._24_4_;
          bVar15 = SUB81(uVar72 >> 7,0);
          auVar123._28_4_ = (uint)bVar15 * auVar102._28_4_ | (uint)!bVar15 * auVar107._28_4_;
          bVar15 = (bool)((byte)uVar72 & 1);
          auVar124._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar105._0_4_);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar105._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar105._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar105._12_4_);
          bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar105._16_4_);
          bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar105._20_4_);
          bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar105._24_4_);
          bVar15 = SUB81(uVar72 >> 7,0);
          auVar124._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar105._28_4_;
          auVar199._8_4_ = 0x80000000;
          auVar199._0_8_ = 0x8000000080000000;
          auVar199._12_4_ = 0x80000000;
          auVar199._16_4_ = 0x80000000;
          auVar199._20_4_ = 0x80000000;
          auVar199._24_4_ = 0x80000000;
          auVar199._28_4_ = 0x80000000;
          auVar97 = vxorps_avx512vl(auVar123,auVar199);
          auVar91 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
          auVar95 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar91));
          auVar7 = vfmadd231ps_fma(auVar95,auVar122,auVar122);
          auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar208._8_4_ = 0xbf000000;
          auVar208._0_8_ = 0xbf000000bf000000;
          auVar208._12_4_ = 0xbf000000;
          auVar208._16_4_ = 0xbf000000;
          auVar208._20_4_ = 0xbf000000;
          auVar208._24_4_ = 0xbf000000;
          auVar208._28_4_ = 0xbf000000;
          fVar161 = auVar95._0_4_;
          fVar142 = auVar95._4_4_;
          fVar152 = auVar95._8_4_;
          fVar153 = auVar95._12_4_;
          fVar154 = auVar95._16_4_;
          fVar172 = auVar95._20_4_;
          fVar84 = auVar95._24_4_;
          auVar55._4_4_ = fVar142 * fVar142 * fVar142 * auVar7._4_4_ * -0.5;
          auVar55._0_4_ = fVar161 * fVar161 * fVar161 * auVar7._0_4_ * -0.5;
          auVar55._8_4_ = fVar152 * fVar152 * fVar152 * auVar7._8_4_ * -0.5;
          auVar55._12_4_ = fVar153 * fVar153 * fVar153 * auVar7._12_4_ * -0.5;
          auVar55._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
          auVar55._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar55._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
          auVar55._28_4_ = auVar122._28_4_;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar95 = vfmadd231ps_avx512vl(auVar55,auVar107,auVar95);
          auVar56._4_4_ = auVar122._4_4_ * auVar95._4_4_;
          auVar56._0_4_ = auVar122._0_4_ * auVar95._0_4_;
          auVar56._8_4_ = auVar122._8_4_ * auVar95._8_4_;
          auVar56._12_4_ = auVar122._12_4_ * auVar95._12_4_;
          auVar56._16_4_ = auVar122._16_4_ * auVar95._16_4_;
          auVar56._20_4_ = auVar122._20_4_ * auVar95._20_4_;
          auVar56._24_4_ = auVar122._24_4_ * auVar95._24_4_;
          auVar56._28_4_ = 0;
          auVar57._4_4_ = auVar95._4_4_ * -auVar121._4_4_;
          auVar57._0_4_ = auVar95._0_4_ * -auVar121._0_4_;
          auVar57._8_4_ = auVar95._8_4_ * -auVar121._8_4_;
          auVar57._12_4_ = auVar95._12_4_ * -auVar121._12_4_;
          auVar57._16_4_ = auVar95._16_4_ * -auVar121._16_4_;
          auVar57._20_4_ = auVar95._20_4_ * -auVar121._20_4_;
          auVar57._24_4_ = auVar95._24_4_ * -auVar121._24_4_;
          auVar57._28_4_ = auVar122._28_4_;
          auVar106 = vmulps_avx512vl(auVar95,ZEXT1632(auVar91));
          auVar105 = ZEXT1632(auVar91);
          auVar95 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar105);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar124,auVar124);
          auVar99 = vrsqrt14ps_avx512vl(auVar95);
          auVar95 = vmulps_avx512vl(auVar95,auVar208);
          fVar161 = auVar99._0_4_;
          fVar142 = auVar99._4_4_;
          fVar152 = auVar99._8_4_;
          fVar153 = auVar99._12_4_;
          fVar154 = auVar99._16_4_;
          fVar172 = auVar99._20_4_;
          fVar84 = auVar99._24_4_;
          auVar58._4_4_ = fVar142 * fVar142 * fVar142 * auVar95._4_4_;
          auVar58._0_4_ = fVar161 * fVar161 * fVar161 * auVar95._0_4_;
          auVar58._8_4_ = fVar152 * fVar152 * fVar152 * auVar95._8_4_;
          auVar58._12_4_ = fVar153 * fVar153 * fVar153 * auVar95._12_4_;
          auVar58._16_4_ = fVar154 * fVar154 * fVar154 * auVar95._16_4_;
          auVar58._20_4_ = fVar172 * fVar172 * fVar172 * auVar95._20_4_;
          auVar58._24_4_ = fVar84 * fVar84 * fVar84 * auVar95._24_4_;
          auVar58._28_4_ = auVar95._28_4_;
          auVar95 = vfmadd231ps_avx512vl(auVar58,auVar107,auVar99);
          auVar59._4_4_ = auVar124._4_4_ * auVar95._4_4_;
          auVar59._0_4_ = auVar124._0_4_ * auVar95._0_4_;
          auVar59._8_4_ = auVar124._8_4_ * auVar95._8_4_;
          auVar59._12_4_ = auVar124._12_4_ * auVar95._12_4_;
          auVar59._16_4_ = auVar124._16_4_ * auVar95._16_4_;
          auVar59._20_4_ = auVar124._20_4_ * auVar95._20_4_;
          auVar59._24_4_ = auVar124._24_4_ * auVar95._24_4_;
          auVar59._28_4_ = auVar99._28_4_;
          auVar60._4_4_ = auVar95._4_4_ * auVar97._4_4_;
          auVar60._0_4_ = auVar95._0_4_ * auVar97._0_4_;
          auVar60._8_4_ = auVar95._8_4_ * auVar97._8_4_;
          auVar60._12_4_ = auVar95._12_4_ * auVar97._12_4_;
          auVar60._16_4_ = auVar95._16_4_ * auVar97._16_4_;
          auVar60._20_4_ = auVar95._20_4_ * auVar97._20_4_;
          auVar60._24_4_ = auVar95._24_4_ * auVar97._24_4_;
          auVar60._28_4_ = auVar97._28_4_;
          auVar97 = vmulps_avx512vl(auVar95,auVar105);
          auVar7 = vfmadd213ps_fma(auVar56,auVar101,ZEXT1632(auVar86));
          auVar8 = vfmadd213ps_fma(auVar57,auVar101,ZEXT1632(auVar87));
          auVar107 = vfmadd213ps_avx512vl(auVar106,auVar101,auVar96);
          auVar99 = vfmadd213ps_avx512vl(auVar59,auVar94,ZEXT1632(auVar90));
          auVar10 = vfnmadd213ps_fma(auVar56,auVar101,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar60,auVar94,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar57,auVar101,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar97,auVar94,auVar98);
          auVar158 = vfnmadd231ps_fma(auVar96,auVar101,auVar106);
          auVar156 = vfnmadd213ps_fma(auVar59,auVar94,ZEXT1632(auVar90));
          auVar157 = vfnmadd213ps_fma(auVar60,auVar94,ZEXT1632(auVar6));
          auVar88 = vfnmadd231ps_fma(auVar98,auVar94,auVar97);
          auVar98 = vsubps_avx512vl(auVar99,ZEXT1632(auVar10));
          auVar97 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar11));
          auVar95 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar158));
          auVar61._4_4_ = auVar97._4_4_ * auVar158._4_4_;
          auVar61._0_4_ = auVar97._0_4_ * auVar158._0_4_;
          auVar61._8_4_ = auVar97._8_4_ * auVar158._8_4_;
          auVar61._12_4_ = auVar97._12_4_ * auVar158._12_4_;
          auVar61._16_4_ = auVar97._16_4_ * 0.0;
          auVar61._20_4_ = auVar97._20_4_ * 0.0;
          auVar61._24_4_ = auVar97._24_4_ * 0.0;
          auVar61._28_4_ = auVar106._28_4_;
          auVar90 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar11),auVar95);
          auVar62._4_4_ = auVar95._4_4_ * auVar10._4_4_;
          auVar62._0_4_ = auVar95._0_4_ * auVar10._0_4_;
          auVar62._8_4_ = auVar95._8_4_ * auVar10._8_4_;
          auVar62._12_4_ = auVar95._12_4_ * auVar10._12_4_;
          auVar62._16_4_ = auVar95._16_4_ * 0.0;
          auVar62._20_4_ = auVar95._20_4_ * 0.0;
          auVar62._24_4_ = auVar95._24_4_ * 0.0;
          auVar62._28_4_ = auVar95._28_4_;
          auVar6 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar158),auVar98);
          auVar63._4_4_ = auVar11._4_4_ * auVar98._4_4_;
          auVar63._0_4_ = auVar11._0_4_ * auVar98._0_4_;
          auVar63._8_4_ = auVar11._8_4_ * auVar98._8_4_;
          auVar63._12_4_ = auVar11._12_4_ * auVar98._12_4_;
          auVar63._16_4_ = auVar98._16_4_ * 0.0;
          auVar63._20_4_ = auVar98._20_4_ * 0.0;
          auVar63._24_4_ = auVar98._24_4_ * 0.0;
          auVar63._28_4_ = auVar98._28_4_;
          auVar9 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar10),auVar97);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar105,ZEXT1632(auVar6));
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,ZEXT1632(auVar90));
          auVar93 = ZEXT1632(auVar91);
          uVar72 = vcmpps_avx512vl(auVar97,auVar93,2);
          bVar71 = (byte)uVar72;
          fVar134 = (float)((uint)(bVar71 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar156._0_4_);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar136 = (float)((uint)bVar15 * auVar7._4_4_ | (uint)!bVar15 * auVar156._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar139 = (float)((uint)bVar15 * auVar7._8_4_ | (uint)!bVar15 * auVar156._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar140 = (float)((uint)bVar15 * auVar7._12_4_ | (uint)!bVar15 * auVar156._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar136,fVar134))));
          fVar135 = (float)((uint)(bVar71 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar157._0_4_);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar138 = (float)((uint)bVar15 * auVar8._4_4_ | (uint)!bVar15 * auVar157._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar137 = (float)((uint)bVar15 * auVar8._8_4_ | (uint)!bVar15 * auVar157._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar141 = (float)((uint)bVar15 * auVar8._12_4_ | (uint)!bVar15 * auVar157._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar137,CONCAT44(fVar138,fVar135))));
          auVar125._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar88._0_4_);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar88._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar88._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar88._12_4_)
          ;
          fVar161 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
          auVar125._16_4_ = fVar161;
          fVar152 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
          auVar125._20_4_ = fVar152;
          fVar142 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
          auVar125._24_4_ = fVar142;
          iVar1 = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
          auVar125._28_4_ = iVar1;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar99);
          auVar126._0_4_ =
               (uint)(bVar71 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar90._0_4_;
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar90._4_4_;
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar90._8_4_;
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar90._12_4_;
          auVar126._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar97._16_4_;
          auVar126._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar97._20_4_;
          auVar126._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar97._24_4_;
          auVar126._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar86));
          auVar127._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar7._0_4_
                      );
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar7._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar7._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar7._12_4_);
          fVar172 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar97._16_4_);
          auVar127._16_4_ = fVar172;
          fVar154 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar97._20_4_);
          auVar127._20_4_ = fVar154;
          fVar153 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar97._24_4_);
          auVar127._24_4_ = fVar153;
          auVar127._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar158),ZEXT1632(auVar87));
          auVar128._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar8._0_4_
                      );
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar8._4_4_);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar8._8_4_);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar8._12_4_);
          fVar160 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar97._16_4_);
          auVar128._16_4_ = fVar160;
          fVar85 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar97._20_4_);
          auVar128._20_4_ = fVar85;
          fVar84 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar97._24_4_);
          auVar128._24_4_ = fVar84;
          iVar2 = (uint)(byte)(uVar72 >> 7) * auVar97._28_4_;
          auVar128._28_4_ = iVar2;
          auVar129._0_4_ =
               (uint)(bVar71 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar99._0_4_;
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar15 * (int)auVar10._4_4_ | (uint)!bVar15 * auVar99._4_4_;
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar15 * (int)auVar10._8_4_ | (uint)!bVar15 * auVar99._8_4_;
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar15 * (int)auVar10._12_4_ | (uint)!bVar15 * auVar99._12_4_;
          auVar129._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar99._16_4_;
          auVar129._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar99._20_4_;
          auVar129._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar99._24_4_;
          auVar129._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar99._28_4_;
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar99 = vsubps_avx512vl(auVar129,auVar105);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar11._12_4_ |
                                                  (uint)!bVar19 * auVar86._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar11._8_4_ |
                                                           (uint)!bVar17 * auVar86._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar11._4_4_ |
                                                                    (uint)!bVar15 * auVar86._4_4_,
                                                                    (uint)(bVar71 & 1) *
                                                                    (int)auVar11._0_4_ |
                                                                    (uint)!(bool)(bVar71 & 1) *
                                                                    auVar86._0_4_)))),auVar102);
          auVar190 = ZEXT3264(auVar95);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar158._12_4_ |
                                                   (uint)!bVar20 * auVar87._12_4_,
                                                   CONCAT48((uint)bVar18 * (int)auVar158._8_4_ |
                                                            (uint)!bVar18 * auVar87._8_4_,
                                                            CONCAT44((uint)bVar16 *
                                                                     (int)auVar158._4_4_ |
                                                                     (uint)!bVar16 * auVar87._4_4_,
                                                                     (uint)(bVar71 & 1) *
                                                                     (int)auVar158._0_4_ |
                                                                     (uint)!(bool)(bVar71 & 1) *
                                                                     auVar87._0_4_)))),auVar125);
          auVar106 = vsubps_avx(auVar105,auVar126);
          auVar194 = ZEXT3264(auVar106);
          auVar98 = vsubps_avx(auVar102,auVar127);
          auVar96 = vsubps_avx(auVar125,auVar128);
          auVar64._4_4_ = auVar107._4_4_ * fVar136;
          auVar64._0_4_ = auVar107._0_4_ * fVar134;
          auVar64._8_4_ = auVar107._8_4_ * fVar139;
          auVar64._12_4_ = auVar107._12_4_ * fVar140;
          auVar64._16_4_ = auVar107._16_4_ * 0.0;
          auVar64._20_4_ = auVar107._20_4_ * 0.0;
          auVar64._24_4_ = auVar107._24_4_ * 0.0;
          auVar64._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar64,auVar125,auVar99);
          auVar174._0_4_ = fVar135 * auVar99._0_4_;
          auVar174._4_4_ = fVar138 * auVar99._4_4_;
          auVar174._8_4_ = fVar137 * auVar99._8_4_;
          auVar174._12_4_ = fVar141 * auVar99._12_4_;
          auVar174._16_4_ = auVar99._16_4_ * 0.0;
          auVar174._20_4_ = auVar99._20_4_ * 0.0;
          auVar174._24_4_ = auVar99._24_4_ * 0.0;
          auVar174._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar174,auVar105,auVar95);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar93,ZEXT1632(auVar86));
          auVar187._0_4_ = auVar95._0_4_ * auVar125._0_4_;
          auVar187._4_4_ = auVar95._4_4_ * auVar125._4_4_;
          auVar187._8_4_ = auVar95._8_4_ * auVar125._8_4_;
          auVar187._12_4_ = auVar95._12_4_ * auVar125._12_4_;
          auVar187._16_4_ = auVar95._16_4_ * fVar161;
          auVar187._20_4_ = auVar95._20_4_ * fVar152;
          auVar187._24_4_ = auVar95._24_4_ * fVar142;
          auVar187._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar187,auVar102,auVar107);
          auVar100 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar86));
          auVar97 = vmulps_avx512vl(auVar96,auVar126);
          auVar97 = vfmsub231ps_avx512vl(auVar97,auVar106,auVar128);
          auVar65._4_4_ = auVar98._4_4_ * auVar128._4_4_;
          auVar65._0_4_ = auVar98._0_4_ * auVar128._0_4_;
          auVar65._8_4_ = auVar98._8_4_ * auVar128._8_4_;
          auVar65._12_4_ = auVar98._12_4_ * auVar128._12_4_;
          auVar65._16_4_ = auVar98._16_4_ * fVar160;
          auVar65._20_4_ = auVar98._20_4_ * fVar85;
          auVar65._24_4_ = auVar98._24_4_ * fVar84;
          auVar65._28_4_ = iVar2;
          auVar86 = vfmsub231ps_fma(auVar65,auVar127,auVar96);
          auVar188._0_4_ = auVar127._0_4_ * auVar106._0_4_;
          auVar188._4_4_ = auVar127._4_4_ * auVar106._4_4_;
          auVar188._8_4_ = auVar127._8_4_ * auVar106._8_4_;
          auVar188._12_4_ = auVar127._12_4_ * auVar106._12_4_;
          auVar188._16_4_ = fVar172 * auVar106._16_4_;
          auVar188._20_4_ = fVar154 * auVar106._20_4_;
          auVar188._24_4_ = fVar153 * auVar106._24_4_;
          auVar188._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar188,auVar98,auVar126);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar93,auVar97);
          auVar92 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar86));
          auVar189 = ZEXT3264(auVar92);
          auVar97 = vmaxps_avx(auVar100,auVar92);
          uVar155 = vcmpps_avx512vl(auVar97,auVar93,2);
          bVar82 = bVar82 & (byte)uVar155;
          if (bVar82 != 0) {
            auVar66._4_4_ = auVar96._4_4_ * auVar95._4_4_;
            auVar66._0_4_ = auVar96._0_4_ * auVar95._0_4_;
            auVar66._8_4_ = auVar96._8_4_ * auVar95._8_4_;
            auVar66._12_4_ = auVar96._12_4_ * auVar95._12_4_;
            auVar66._16_4_ = auVar96._16_4_ * auVar95._16_4_;
            auVar66._20_4_ = auVar96._20_4_ * auVar95._20_4_;
            auVar66._24_4_ = auVar96._24_4_ * auVar95._24_4_;
            auVar66._28_4_ = auVar97._28_4_;
            auVar6 = vfmsub231ps_fma(auVar66,auVar98,auVar107);
            auVar67._4_4_ = auVar107._4_4_ * auVar106._4_4_;
            auVar67._0_4_ = auVar107._0_4_ * auVar106._0_4_;
            auVar67._8_4_ = auVar107._8_4_ * auVar106._8_4_;
            auVar67._12_4_ = auVar107._12_4_ * auVar106._12_4_;
            auVar67._16_4_ = auVar107._16_4_ * auVar106._16_4_;
            auVar67._20_4_ = auVar107._20_4_ * auVar106._20_4_;
            auVar67._24_4_ = auVar107._24_4_ * auVar106._24_4_;
            auVar67._28_4_ = auVar107._28_4_;
            auVar90 = vfmsub231ps_fma(auVar67,auVar99,auVar96);
            auVar68._4_4_ = auVar98._4_4_ * auVar99._4_4_;
            auVar68._0_4_ = auVar98._0_4_ * auVar99._0_4_;
            auVar68._8_4_ = auVar98._8_4_ * auVar99._8_4_;
            auVar68._12_4_ = auVar98._12_4_ * auVar99._12_4_;
            auVar68._16_4_ = auVar98._16_4_ * auVar99._16_4_;
            auVar68._20_4_ = auVar98._20_4_ * auVar99._20_4_;
            auVar68._24_4_ = auVar98._24_4_ * auVar99._24_4_;
            auVar68._28_4_ = auVar98._28_4_;
            auVar7 = vfmsub231ps_fma(auVar68,auVar106,auVar95);
            auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar7));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar6),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar97 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
            auVar194 = ZEXT3264(auVar97);
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar95 = vfnmadd213ps_avx512vl(auVar97,ZEXT1632(auVar87),auVar31);
            auVar86 = vfmadd132ps_fma(auVar95,auVar97,auVar97);
            auVar190 = ZEXT1664(auVar86);
            auVar69._4_4_ = auVar7._4_4_ * auVar125._4_4_;
            auVar69._0_4_ = auVar7._0_4_ * auVar125._0_4_;
            auVar69._8_4_ = auVar7._8_4_ * auVar125._8_4_;
            auVar69._12_4_ = auVar7._12_4_ * auVar125._12_4_;
            auVar69._16_4_ = fVar161 * 0.0;
            auVar69._20_4_ = fVar152 * 0.0;
            auVar69._24_4_ = fVar142 * 0.0;
            auVar69._28_4_ = iVar1;
            auVar90 = vfmadd231ps_fma(auVar69,auVar102,ZEXT1632(auVar90));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar105,ZEXT1632(auVar6));
            fVar142 = auVar86._0_4_;
            fVar152 = auVar86._4_4_;
            fVar153 = auVar86._8_4_;
            fVar154 = auVar86._12_4_;
            local_280 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar154,
                                           CONCAT48(auVar90._8_4_ * fVar153,
                                                    CONCAT44(auVar90._4_4_ * fVar152,
                                                             auVar90._0_4_ * fVar142))));
            auVar197 = ZEXT3264(local_280);
            uVar155 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar161 = (ray->super_RayK<1>).tfar;
            auVar32._4_4_ = fVar161;
            auVar32._0_4_ = fVar161;
            auVar32._8_4_ = fVar161;
            auVar32._12_4_ = fVar161;
            auVar32._16_4_ = fVar161;
            auVar32._20_4_ = fVar161;
            auVar32._24_4_ = fVar161;
            auVar32._28_4_ = fVar161;
            uVar21 = vcmpps_avx512vl(local_280,auVar32,2);
            bVar82 = (byte)uVar155 & (byte)uVar21 & bVar82;
            if (bVar82 != 0) {
              uVar83 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar83 = bVar82 & uVar83;
              if ((char)uVar83 != '\0') {
                fVar161 = auVar100._0_4_ * fVar142;
                fVar172 = auVar100._4_4_ * fVar152;
                auVar70._4_4_ = fVar172;
                auVar70._0_4_ = fVar161;
                fVar84 = auVar100._8_4_ * fVar153;
                auVar70._8_4_ = fVar84;
                fVar85 = auVar100._12_4_ * fVar154;
                auVar70._12_4_ = fVar85;
                fVar160 = auVar100._16_4_ * 0.0;
                auVar70._16_4_ = fVar160;
                fVar134 = auVar100._20_4_ * 0.0;
                auVar70._20_4_ = fVar134;
                fVar135 = auVar100._24_4_ * 0.0;
                auVar70._24_4_ = fVar135;
                auVar70._28_4_ = auVar100._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar97 = vsubps_avx(auVar171,auVar70);
                local_2c0._0_4_ =
                     (float)((uint)(bVar71 & 1) * (int)fVar161 |
                            (uint)!(bool)(bVar71 & 1) * auVar97._0_4_);
                bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar15 * (int)fVar172 | (uint)!bVar15 * auVar97._4_4_);
                bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar15 * (int)fVar84 | (uint)!bVar15 * auVar97._8_4_);
                bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar15 * (int)fVar85 | (uint)!bVar15 * auVar97._12_4_);
                bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar15 * (int)fVar160 | (uint)!bVar15 * auVar97._16_4_);
                bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar15 * (int)fVar134 | (uint)!bVar15 * auVar97._20_4_);
                bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar15 * (int)fVar135 | (uint)!bVar15 * auVar97._24_4_);
                bVar15 = SUB81(uVar72 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar97._28_4_);
                auVar97 = vsubps_avx(auVar94,auVar101);
                auVar86 = vfmadd213ps_fma(auVar97,local_2c0,auVar101);
                fVar161 = pre->depth_scale;
                auVar33._4_4_ = fVar161;
                auVar33._0_4_ = fVar161;
                auVar33._8_4_ = fVar161;
                auVar33._12_4_ = fVar161;
                auVar33._16_4_ = fVar161;
                auVar33._20_4_ = fVar161;
                auVar33._24_4_ = fVar161;
                auVar33._28_4_ = fVar161;
                auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                             CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                      CONCAT44(auVar86._4_4_ +
                                                                               auVar86._4_4_,
                                                                               auVar86._0_4_ +
                                                                               auVar86._0_4_)))),
                                          auVar33);
                uVar76 = vcmpps_avx512vl(local_280,auVar97,6);
                uVar83 = uVar83 & uVar76;
                bVar82 = (byte)uVar83;
                if (bVar82 != 0) {
                  auVar159._0_4_ = auVar92._0_4_ * fVar142;
                  auVar159._4_4_ = auVar92._4_4_ * fVar152;
                  auVar159._8_4_ = auVar92._8_4_ * fVar153;
                  auVar159._12_4_ = auVar92._12_4_ * fVar154;
                  auVar159._16_4_ = auVar92._16_4_ * 0.0;
                  auVar159._20_4_ = auVar92._20_4_ * 0.0;
                  auVar159._24_4_ = auVar92._24_4_ * 0.0;
                  auVar159._28_4_ = 0;
                  auVar175._8_4_ = 0x3f800000;
                  auVar175._0_8_ = 0x3f8000003f800000;
                  auVar175._12_4_ = 0x3f800000;
                  auVar175._16_4_ = 0x3f800000;
                  auVar175._20_4_ = 0x3f800000;
                  auVar175._24_4_ = 0x3f800000;
                  auVar175._28_4_ = 0x3f800000;
                  auVar97 = vsubps_avx(auVar175,auVar159);
                  auVar130._0_4_ =
                       (uint)(bVar71 & 1) * (int)auVar159._0_4_ |
                       (uint)!(bool)(bVar71 & 1) * auVar97._0_4_;
                  bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar15 * (int)auVar159._4_4_ | (uint)!bVar15 * auVar97._4_4_;
                  bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar15 * (int)auVar159._8_4_ | (uint)!bVar15 * auVar97._8_4_;
                  bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar15 * (int)auVar159._12_4_ | (uint)!bVar15 * auVar97._12_4_;
                  bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
                  auVar130._16_4_ =
                       (uint)bVar15 * (int)auVar159._16_4_ | (uint)!bVar15 * auVar97._16_4_;
                  bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                  auVar130._20_4_ =
                       (uint)bVar15 * (int)auVar159._20_4_ | (uint)!bVar15 * auVar97._20_4_;
                  bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
                  auVar130._24_4_ =
                       (uint)bVar15 * (int)auVar159._24_4_ | (uint)!bVar15 * auVar97._24_4_;
                  auVar130._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar97._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar130,auVar175,auVar34);
                  local_260 = (int)lVar81;
                  local_25c = iVar13;
                  auVar194 = ZEXT1664(local_4e0);
                  local_250 = local_4e0;
                  local_240 = local_4b0._0_8_;
                  uStack_238 = local_4b0._8_8_;
                  local_230 = local_4c0._0_8_;
                  uStack_228 = local_4c0._8_8_;
                  local_220 = local_4d0;
                  uStack_218 = uStack_4c8;
                  pGVar77 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar77->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar75 = (uint)uVar83;
                    auVar86 = vcvtsi2ss_avx512f(auVar91,(int)lVar81);
                    fVar161 = auVar86._0_4_;
                    local_200[0] = (fVar161 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar161 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar161 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar161 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar161 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar161 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar161 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar161 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar97 = vblendmps_avx512vl(auVar149,local_280);
                    auVar131._0_4_ =
                         (uint)(bVar82 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)((byte)(uVar83 >> 1) & 1);
                    auVar131._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                    auVar131._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                    auVar131._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar83 >> 4) & 1);
                    auVar131._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                    auVar131._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                    auVar131._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = SUB81(uVar83 >> 7,0);
                    auVar131._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar97 = vshufps_avx(auVar131,auVar131,0xb1);
                    auVar97 = vminps_avx(auVar131,auVar97);
                    auVar95 = vshufpd_avx(auVar97,auVar97,5);
                    auVar97 = vminps_avx(auVar97,auVar95);
                    auVar95 = vpermpd_avx2(auVar97,0x4e);
                    auVar97 = vminps_avx(auVar97,auVar95);
                    uVar155 = vcmpps_avx512vl(auVar131,auVar97,0);
                    local_4e4 = uVar75;
                    uVar73 = uVar75;
                    if ((bVar82 & (byte)uVar155) != 0) {
                      uVar73 = (uint)(bVar82 & (byte)uVar155);
                    }
                    uVar74 = 0;
                    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                      uVar74 = uVar74 + 1;
                    }
                    uVar72 = (ulong)uVar74;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar209._0_32_);
                      local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_440 = local_280;
                      local_4a0._0_8_ = pGVar77;
                      do {
                        local_484 = local_200[uVar72];
                        local_480 = *(undefined4 *)(local_1e0 + uVar72 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar72 * 4);
                        local_518.context = context->user;
                        fVar161 = 1.0 - local_484;
                        auVar24._8_4_ = 0x80000000;
                        auVar24._0_8_ = 0x8000000080000000;
                        auVar24._12_4_ = 0x80000000;
                        auVar90 = vxorps_avx512vl(ZEXT416((uint)fVar161),auVar24);
                        auVar86 = ZEXT416((uint)(local_484 * fVar161 * 4.0));
                        auVar87 = vfnmsub213ss_fma(ZEXT416((uint)local_484),ZEXT416((uint)local_484)
                                                   ,auVar86);
                        auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),
                                                  auVar86);
                        fVar161 = fVar161 * auVar90._0_4_ * 0.5;
                        fVar142 = auVar87._0_4_ * 0.5;
                        auVar190 = ZEXT464((uint)fVar142);
                        fVar152 = auVar86._0_4_ * 0.5;
                        fVar153 = local_484 * local_484 * 0.5;
                        auVar180._0_4_ = fVar153 * (float)local_4d0._0_4_;
                        auVar180._4_4_ = fVar153 * (float)local_4d0._4_4_;
                        auVar180._8_4_ = fVar153 * (float)uStack_4c8;
                        auVar180._12_4_ = fVar153 * uStack_4c8._4_4_;
                        auVar166._4_4_ = fVar152;
                        auVar166._0_4_ = fVar152;
                        auVar166._8_4_ = fVar152;
                        auVar166._12_4_ = fVar152;
                        auVar86 = vfmadd132ps_fma(auVar166,auVar180,local_4c0);
                        auVar181._4_4_ = fVar142;
                        auVar181._0_4_ = fVar142;
                        auVar181._8_4_ = fVar142;
                        auVar181._12_4_ = fVar142;
                        auVar86 = vfmadd132ps_fma(auVar181,auVar86,local_4b0);
                        auVar189 = ZEXT1664(auVar86);
                        auVar167._4_4_ = fVar161;
                        auVar167._0_4_ = fVar161;
                        auVar167._8_4_ = fVar161;
                        auVar167._12_4_ = fVar161;
                        auVar87 = vfmadd213ps_fma(auVar167,auVar194._0_16_,auVar86);
                        local_490 = vmovlps_avx(auVar87);
                        local_488 = vextractps_avx(auVar87,2);
                        local_47c = uVar12;
                        local_478 = (int)local_550;
                        local_474 = (local_518.context)->instID[0];
                        local_470 = (local_518.context)->instPrimID[0];
                        local_554 = -1;
                        local_518.valid = &local_554;
                        local_518.geometryUserPtr = pGVar77->userPtr;
                        local_518.ray = (RTCRayN *)ray;
                        local_518.hit = (RTCHitN *)&local_490;
                        local_518.N = 1;
                        if (pGVar77->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019e5ccc:
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_4a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar189 = ZEXT1664(auVar189._0_16_);
                            auVar190 = ZEXT1664(auVar190._0_16_);
                            (*p_Var14)(&local_518);
                            auVar197 = ZEXT3264(local_440);
                            auVar194 = ZEXT1664(local_4e0);
                            ray = local_540;
                            context = local_548;
                            if (*local_518.valid == 0) goto LAB_019e5d71;
                          }
                          (((Vec3f *)((long)local_518.ray + 0x30))->field_0).components[0] =
                               *(float *)local_518.hit;
                          (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_518.hit + 4);
                          (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_518.hit + 8);
                          *(float *)((long)local_518.ray + 0x3c) = *(float *)(local_518.hit + 0xc);
                          *(float *)((long)local_518.ray + 0x40) = *(float *)(local_518.hit + 0x10);
                          *(float *)((long)local_518.ray + 0x44) = *(float *)(local_518.hit + 0x14);
                          *(float *)((long)local_518.ray + 0x48) = *(float *)(local_518.hit + 0x18);
                          *(float *)((long)local_518.ray + 0x4c) = *(float *)(local_518.hit + 0x1c);
                          *(float *)((long)local_518.ray + 0x50) = *(float *)(local_518.hit + 0x20);
                        }
                        else {
                          auVar189 = ZEXT1664(auVar86);
                          auVar190 = ZEXT464((uint)fVar142);
                          (*pGVar77->intersectionFilterN)(&local_518);
                          auVar197 = ZEXT3264(local_440);
                          auVar194 = ZEXT1664(local_4e0);
                          ray = local_540;
                          context = local_548;
                          if (*local_518.valid != 0) goto LAB_019e5ccc;
LAB_019e5d71:
                          (local_540->super_RayK<1>).tfar = (float)local_420._0_4_;
                          ray = local_540;
                          context = local_548;
                        }
                        bVar82 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar75;
                        fVar161 = (ray->super_RayK<1>).tfar;
                        auVar35._4_4_ = fVar161;
                        auVar35._0_4_ = fVar161;
                        auVar35._8_4_ = fVar161;
                        auVar35._12_4_ = fVar161;
                        auVar35._16_4_ = fVar161;
                        auVar35._20_4_ = fVar161;
                        auVar35._24_4_ = fVar161;
                        auVar35._28_4_ = fVar161;
                        uVar155 = vcmpps_avx512vl(auVar197._0_32_,auVar35,2);
                        if ((bVar82 & (byte)uVar155) == 0) goto LAB_019e5e15;
                        local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar82 = bVar82 & (byte)uVar155;
                        uVar75 = (uint)bVar82;
                        auVar150._8_4_ = 0x7f800000;
                        auVar150._0_8_ = 0x7f8000007f800000;
                        auVar150._12_4_ = 0x7f800000;
                        auVar150._16_4_ = 0x7f800000;
                        auVar150._20_4_ = 0x7f800000;
                        auVar150._24_4_ = 0x7f800000;
                        auVar150._28_4_ = 0x7f800000;
                        auVar97 = vblendmps_avx512vl(auVar150,auVar197._0_32_);
                        auVar132._0_4_ =
                             (uint)(bVar82 & 1) * auVar97._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar82 >> 1 & 1);
                        auVar132._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar82 >> 2 & 1);
                        auVar132._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar82 >> 3 & 1);
                        auVar132._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar82 >> 4 & 1);
                        auVar132._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar82 >> 5 & 1);
                        auVar132._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar82 >> 6 & 1);
                        auVar132._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        auVar132._28_4_ =
                             (uint)(bVar82 >> 7) * auVar97._28_4_ |
                             (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                        auVar97 = vshufps_avx(auVar132,auVar132,0xb1);
                        auVar97 = vminps_avx(auVar132,auVar97);
                        auVar95 = vshufpd_avx(auVar97,auVar97,5);
                        auVar97 = vminps_avx(auVar97,auVar95);
                        auVar95 = vpermpd_avx2(auVar97,0x4e);
                        auVar97 = vminps_avx(auVar97,auVar95);
                        uVar155 = vcmpps_avx512vl(auVar132,auVar97,0);
                        bVar71 = (byte)uVar155 & bVar82;
                        if (bVar71 != 0) {
                          bVar82 = bVar71;
                        }
                        uVar73 = 0;
                        for (uVar74 = (uint)bVar82; (uVar74 & 1) == 0;
                            uVar74 = uVar74 >> 1 | 0x80000000) {
                          uVar73 = uVar73 + 1;
                        }
                        uVar72 = (ulong)uVar73;
                        pGVar77 = (Geometry *)local_4a0._0_8_;
                      } while( true );
                    }
                    fVar161 = local_200[uVar72];
                    fVar142 = *(float *)(local_1e0 + uVar72 * 4);
                    fVar152 = 1.0 - fVar161;
                    auVar23._8_4_ = 0x80000000;
                    auVar23._0_8_ = 0x8000000080000000;
                    auVar23._12_4_ = 0x80000000;
                    auVar90 = vxorps_avx512vl(ZEXT416((uint)fVar152),auVar23);
                    auVar86 = ZEXT416((uint)(fVar161 * fVar152 * 4.0));
                    auVar87 = vfnmsub213ss_fma(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),auVar86
                                              );
                    auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),auVar86)
                    ;
                    fVar152 = fVar152 * auVar90._0_4_ * 0.5;
                    fVar153 = auVar87._0_4_ * 0.5;
                    auVar190 = ZEXT464((uint)fVar153);
                    fVar154 = auVar86._0_4_ * 0.5;
                    fVar172 = fVar161 * fVar161 * 0.5;
                    auVar178._0_4_ = fVar172 * (float)local_4d0._0_4_;
                    auVar178._4_4_ = fVar172 * (float)local_4d0._4_4_;
                    auVar178._8_4_ = fVar172 * (float)uStack_4c8;
                    auVar178._12_4_ = fVar172 * uStack_4c8._4_4_;
                    auVar164._4_4_ = fVar154;
                    auVar164._0_4_ = fVar154;
                    auVar164._8_4_ = fVar154;
                    auVar164._12_4_ = fVar154;
                    auVar86 = vfmadd132ps_fma(auVar164,auVar178,local_4c0);
                    auVar179._4_4_ = fVar153;
                    auVar179._0_4_ = fVar153;
                    auVar179._8_4_ = fVar153;
                    auVar179._12_4_ = fVar153;
                    auVar86 = vfmadd132ps_fma(auVar179,auVar86,local_4b0);
                    auVar189 = ZEXT1664(auVar86);
                    auVar165._4_4_ = fVar152;
                    auVar165._0_4_ = fVar152;
                    auVar165._8_4_ = fVar152;
                    auVar165._12_4_ = fVar152;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar72 * 4);
                    auVar86 = vfmadd213ps_fma(auVar165,local_4e0,auVar86);
                    uVar155 = vmovlps_avx(auVar86);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar155;
                    fVar152 = (float)vextractps_avx(auVar86,2);
                    (ray->Ng).field_0.field_0.z = fVar152;
                    ray->u = fVar161;
                    ray->v = fVar142;
                    ray->primID = uVar12;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019e5b21;
      }
    }
    fVar161 = (ray->super_RayK<1>).tfar;
    auVar30._4_4_ = fVar161;
    auVar30._0_4_ = fVar161;
    auVar30._8_4_ = fVar161;
    auVar30._12_4_ = fVar161;
    auVar30._16_4_ = fVar161;
    auVar30._20_4_ = fVar161;
    auVar30._24_4_ = fVar161;
    auVar30._28_4_ = fVar161;
    uVar155 = vcmpps_avx512vl(local_80,auVar30,2);
    uVar78 = (ulong)((uint)uVar78 & (uint)uVar155);
  } while( true );
LAB_019e5e15:
  auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar210 = ZEXT3264(auVar97);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar211 = ZEXT1664(auVar86);
  auVar212 = ZEXT464(0x35000000);
  auVar97 = vmovdqa64_avx512vl(local_140);
  auVar209 = ZEXT3264(auVar97);
  pre = local_538;
  prim = local_528;
  pPVar79 = local_530;
LAB_019e5b21:
  lVar81 = lVar81 + 8;
  goto LAB_019e528b;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }